

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_intra_pred_chroma_mode_3_to_9_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  unkbyte10 Var61;
  unkbyte10 Var62;
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  short sVar73;
  unkbyte10 *pVar74;
  undefined1 (*pauVar75) [12];
  undefined8 *puVar76;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ulong uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ulong uVar90;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i src_temp13_8x16b;
  __m128i src_temp12_8x16b;
  __m128i src_temp11_8x16b;
  __m128i src_temp8_8x16b_1;
  __m128i src_temp7_8x16b_1;
  __m128i src_temp6_8x16b_1;
  __m128i src_temp5_8x16b_1;
  __m128i src_temp4_8x16b_1;
  __m128i src_temp3_8x16b_1;
  __m128i src_temp2_8x16b_1;
  __m128i src_temp1_8x16b_1;
  __m128i temp14_8x16b;
  __m128i temp13_8x16b;
  __m128i temp12_8x16b;
  __m128i temp11_8x16b;
  __m128i temp4_8x16b_1;
  __m128i temp3_8x16b_1;
  __m128i temp2_8x16b_1;
  __m128i temp1_8x16b_1;
  __m128i src_values10_1;
  __m128i fract8_8x16b;
  __m128i fract7_8x16b;
  __m128i fract6_8x16b;
  __m128i fract5_8x16b;
  __m128i fract4_8x16b_1;
  __m128i fract3_8x16b_1;
  __m128i fract2_8x16b_1;
  __m128i fract1_8x16b_1;
  WORD8 ai1_src_temp_val_1 [16];
  WORD8 ai1_fract_temp_val_1 [16];
  WORD16 pi2_ref_main_idx8;
  WORD16 pi2_ref_main_idx7;
  WORD16 pi2_ref_main_idx6;
  WORD16 pi2_ref_main_idx5;
  WORD16 pi2_ref_main_idx4_1;
  WORD16 pi2_ref_main_idx3_1;
  WORD16 pi2_ref_main_idx2_1;
  WORD16 pi2_ref_main_idx1_1;
  __m128i src_temp8_8x16b;
  __m128i src_temp7_8x16b;
  __m128i src_temp6_8x16b;
  __m128i src_temp5_8x16b;
  __m128i src_temp4_8x16b;
  __m128i src_temp3_8x16b;
  __m128i src_temp2_8x16b;
  __m128i src_temp1_8x16b;
  __m128i temp4_8x16b;
  __m128i temp3_8x16b;
  __m128i temp2_8x16b;
  __m128i temp1_8x16b;
  __m128i src_values10;
  __m128i fract4_8x16b;
  __m128i fract3_8x16b;
  __m128i fract2_8x16b;
  __m128i fract1_8x16b;
  WORD8 ai1_src_temp_val [16];
  WORD8 ai1_fract_temp_val [16];
  WORD16 pi2_ref_main_idx4;
  WORD16 pi2_ref_main_idx3;
  WORD16 pi2_ref_main_idx2;
  WORD16 pi2_ref_main_idx1;
  __m128i sm1;
  __m128i res_temp5_4x32b;
  __m128i ref_main_idx_4x32b;
  __m128i two_nt_4x32b;
  __m128i row_4x32b;
  __m128i intra_pred_ang_4x32b;
  __m128i zero_8x16b;
  __m128i fract_4x32b;
  __m128i const_temp4_4x32b;
  __m128i const_temp3_4x32b;
  __m128i const_temp2_4x32b;
  __m128i const_temp_4x32b;
  WORD32 intra_pred_ang;
  WORD32 col;
  WORD32 row;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a0;
  undefined8 uStack_1990;
  undefined8 uStack_1980;
  undefined8 uStack_1970;
  undefined8 uStack_1960;
  undefined8 uStack_1950;
  undefined8 uStack_1940;
  undefined8 uStack_1930;
  char local_1898;
  char cStack_1896;
  char cStack_1894;
  char cStack_1892;
  char cStack_1890;
  char cStack_188e;
  char cStack_188c;
  char cStack_188a;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e0;
  undefined8 uStack_17d0;
  undefined8 uStack_17c0;
  undefined8 uStack_17b0;
  char local_1758;
  char cStack_1756;
  char cStack_1754;
  char cStack_1752;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  short local_1668;
  int local_1664;
  int local_1660;
  short local_1348;
  short sStack_1346;
  short sStack_1344;
  short sStack_1342;
  short sStack_1340;
  short sStack_133e;
  short sStack_133c;
  short sStack_133a;
  short local_1308;
  short sStack_1306;
  short sStack_1304;
  short sStack_1302;
  short sStack_1300;
  short sStack_12fe;
  short sStack_12fc;
  short sStack_12fa;
  short local_12e8;
  short sStack_12e6;
  short sStack_12e4;
  short sStack_12e2;
  short sStack_12e0;
  short sStack_12de;
  short sStack_12dc;
  short sStack_12da;
  short local_12c8;
  short sStack_12c6;
  short sStack_12c4;
  short sStack_12c2;
  short sStack_12c0;
  short sStack_12be;
  short sStack_12bc;
  short sStack_12ba;
  short local_12a8;
  short sStack_12a6;
  short sStack_12a4;
  short sStack_12a2;
  short sStack_12a0;
  short sStack_129e;
  short sStack_129c;
  short sStack_129a;
  short local_1288;
  short sStack_1286;
  short sStack_1284;
  short sStack_1282;
  short sStack_1280;
  short sStack_127e;
  short sStack_127c;
  short sStack_127a;
  short local_1268;
  short sStack_1266;
  short sStack_1264;
  short sStack_1262;
  short sStack_1260;
  short sStack_125e;
  short sStack_125c;
  short sStack_125a;
  short local_1248;
  short sStack_1246;
  short sStack_1244;
  short sStack_1242;
  short sStack_1240;
  short sStack_123e;
  short sStack_123c;
  short sStack_123a;
  short local_1228;
  short sStack_1226;
  short sStack_1224;
  short sStack_1222;
  short sStack_1220;
  short sStack_121e;
  short sStack_121c;
  short sStack_121a;
  short local_11e8;
  short sStack_11e6;
  short sStack_11e4;
  short sStack_11e2;
  short sStack_11e0;
  short sStack_11de;
  short sStack_11dc;
  short sStack_11da;
  short local_11c8;
  short sStack_11c6;
  short sStack_11c4;
  short sStack_11c2;
  short sStack_11c0;
  short sStack_11be;
  short sStack_11bc;
  short sStack_11ba;
  short local_11a8;
  short sStack_11a6;
  short sStack_11a4;
  short sStack_11a2;
  short sStack_11a0;
  short sStack_119e;
  short sStack_119c;
  short sStack_119a;
  short local_1188;
  short sStack_1186;
  short sStack_1184;
  short sStack_1182;
  short sStack_1180;
  short sStack_117e;
  short sStack_117c;
  short sStack_117a;
  short local_1168;
  short sStack_1166;
  short sStack_1164;
  short sStack_1162;
  short sStack_1160;
  short sStack_115e;
  short sStack_115c;
  short sStack_115a;
  short local_1128;
  short sStack_1126;
  short sStack_1124;
  short sStack_1122;
  undefined1 local_10b8;
  undefined1 uStack_10b7;
  undefined1 uStack_10b6;
  undefined1 uStack_10b5;
  undefined1 uStack_10b4;
  undefined1 uStack_10b3;
  undefined1 uStack_10b2;
  undefined1 uStack_10b1;
  undefined1 local_10a8;
  undefined1 uStack_10a7;
  undefined1 uStack_10a6;
  undefined1 uStack_10a5;
  undefined1 uStack_10a4;
  undefined1 uStack_10a3;
  undefined1 uStack_10a2;
  undefined1 uStack_10a1;
  undefined1 local_1098;
  undefined1 uStack_1097;
  undefined1 uStack_1096;
  undefined1 uStack_1095;
  undefined1 uStack_1094;
  undefined1 uStack_1093;
  undefined1 uStack_1092;
  undefined1 uStack_1091;
  undefined1 local_1088;
  undefined1 uStack_1087;
  undefined1 uStack_1086;
  undefined1 uStack_1085;
  undefined1 uStack_1084;
  undefined1 uStack_1083;
  undefined1 uStack_1082;
  undefined1 uStack_1081;
  undefined1 local_1078;
  undefined1 uStack_1077;
  undefined1 uStack_1076;
  undefined1 uStack_1075;
  undefined1 uStack_1074;
  undefined1 uStack_1073;
  undefined1 uStack_1072;
  undefined1 uStack_1071;
  undefined1 local_1068;
  undefined1 uStack_1067;
  undefined1 uStack_1066;
  undefined1 uStack_1065;
  undefined1 uStack_1064;
  undefined1 uStack_1063;
  undefined1 uStack_1062;
  undefined1 uStack_1061;
  undefined1 local_1058;
  undefined1 uStack_1057;
  undefined1 uStack_1056;
  undefined1 uStack_1055;
  undefined1 uStack_1054;
  undefined1 uStack_1053;
  undefined1 uStack_1052;
  undefined1 uStack_1051;
  undefined1 local_1048;
  undefined1 uStack_1047;
  undefined1 uStack_1046;
  undefined1 uStack_1045;
  undefined1 uStack_1044;
  undefined1 uStack_1043;
  undefined1 uStack_1042;
  undefined1 uStack_1041;
  undefined1 local_1038;
  undefined1 uStack_1037;
  undefined1 uStack_1036;
  undefined1 uStack_1035;
  undefined1 uStack_1034;
  undefined1 uStack_1033;
  undefined1 uStack_1032;
  undefined1 uStack_1031;
  undefined1 local_1028;
  undefined1 uStack_1027;
  undefined1 uStack_1026;
  undefined1 uStack_1025;
  undefined1 uStack_1024;
  undefined1 uStack_1023;
  undefined1 uStack_1022;
  undefined1 uStack_1021;
  undefined1 local_1018;
  undefined1 uStack_1017;
  undefined1 uStack_1016;
  undefined1 uStack_1015;
  undefined1 uStack_1014;
  undefined1 uStack_1013;
  undefined1 uStack_1012;
  undefined1 uStack_1011;
  undefined1 local_1008;
  undefined1 uStack_1007;
  undefined1 uStack_1006;
  undefined1 uStack_1005;
  undefined1 uStack_1004;
  undefined1 uStack_1003;
  undefined1 uStack_1002;
  undefined1 uStack_1001;
  undefined1 local_ff8;
  undefined1 uStack_ff7;
  undefined1 uStack_ff6;
  undefined1 uStack_ff5;
  undefined1 uStack_ff4;
  undefined1 uStack_ff3;
  undefined1 uStack_ff2;
  undefined1 uStack_ff1;
  undefined1 local_fe8;
  undefined1 uStack_fe7;
  undefined1 uStack_fe6;
  undefined1 uStack_fe5;
  undefined1 uStack_fe4;
  undefined1 uStack_fe3;
  undefined1 uStack_fe2;
  undefined1 uStack_fe1;
  undefined1 local_fd8;
  undefined1 uStack_fd7;
  undefined1 uStack_fd6;
  undefined1 uStack_fd5;
  undefined1 uStack_fd4;
  undefined1 uStack_fd3;
  undefined1 uStack_fd2;
  undefined1 uStack_fd1;
  undefined1 local_fc8;
  undefined1 uStack_fc7;
  undefined1 uStack_fc6;
  undefined1 uStack_fc5;
  undefined1 uStack_fc4;
  undefined1 uStack_fc3;
  undefined1 uStack_fc2;
  undefined1 uStack_fc1;
  undefined1 local_eb8;
  undefined1 uStack_eb7;
  undefined1 uStack_eb6;
  undefined1 uStack_eb5;
  undefined1 uStack_eb4;
  undefined1 uStack_eb3;
  undefined1 uStack_eb2;
  undefined1 uStack_eb1;
  undefined1 local_ea8;
  undefined1 uStack_ea7;
  undefined1 uStack_ea6;
  undefined1 uStack_ea5;
  undefined1 uStack_ea4;
  undefined1 uStack_ea3;
  undefined1 uStack_ea2;
  undefined1 uStack_ea1;
  undefined1 local_e98;
  undefined1 uStack_e97;
  undefined1 uStack_e96;
  undefined1 uStack_e95;
  undefined1 uStack_e94;
  undefined1 uStack_e93;
  undefined1 uStack_e92;
  undefined1 uStack_e91;
  undefined1 local_e88;
  undefined1 uStack_e87;
  undefined1 uStack_e86;
  undefined1 uStack_e85;
  undefined1 uStack_e84;
  undefined1 uStack_e83;
  undefined1 uStack_e82;
  undefined1 uStack_e81;
  undefined1 local_e78;
  undefined1 uStack_e77;
  undefined1 uStack_e76;
  undefined1 uStack_e75;
  undefined1 uStack_e74;
  undefined1 uStack_e73;
  undefined1 uStack_e72;
  undefined1 uStack_e71;
  undefined1 local_e68;
  undefined1 uStack_e67;
  undefined1 uStack_e66;
  undefined1 uStack_e65;
  undefined1 uStack_e64;
  undefined1 uStack_e63;
  undefined1 uStack_e62;
  undefined1 uStack_e61;
  undefined1 local_e58;
  undefined1 uStack_e57;
  undefined1 uStack_e56;
  undefined1 uStack_e55;
  undefined1 uStack_e54;
  undefined1 uStack_e53;
  undefined1 uStack_e52;
  undefined1 uStack_e51;
  undefined1 local_e48;
  undefined1 uStack_e47;
  undefined1 uStack_e46;
  undefined1 uStack_e45;
  undefined1 uStack_e44;
  undefined1 uStack_e43;
  undefined1 uStack_e42;
  undefined1 uStack_e41;
  short local_da8;
  short sStack_da6;
  short sStack_da4;
  short sStack_da2;
  short sStack_da0;
  short sStack_d9e;
  short sStack_d9c;
  short sStack_d9a;
  short local_d88;
  short sStack_d86;
  short sStack_d84;
  short sStack_d82;
  short sStack_d80;
  short sStack_d7e;
  short sStack_d7c;
  short sStack_d7a;
  short local_d68;
  short sStack_d66;
  short sStack_d64;
  short sStack_d62;
  short sStack_d60;
  short sStack_d5e;
  short sStack_d5c;
  short sStack_d5a;
  short local_d48;
  short sStack_d46;
  short sStack_d44;
  short sStack_d42;
  short sStack_d40;
  short sStack_d3e;
  short sStack_d3c;
  short sStack_d3a;
  short local_d28;
  short sStack_d26;
  short sStack_d24;
  short sStack_d22;
  short sStack_d20;
  short sStack_d1e;
  short sStack_d1c;
  short sStack_d1a;
  short local_d08;
  short sStack_d06;
  short sStack_d04;
  short sStack_d02;
  short sStack_d00;
  short sStack_cfe;
  short sStack_cfc;
  short sStack_cfa;
  short local_ce8;
  short sStack_ce6;
  short sStack_ce4;
  short sStack_ce2;
  short sStack_ce0;
  short sStack_cde;
  short sStack_cdc;
  short sStack_cda;
  short local_cc8;
  short sStack_cc6;
  short sStack_cc4;
  short sStack_cc2;
  short sStack_cc0;
  short sStack_cbe;
  short sStack_cbc;
  short sStack_cba;
  short local_ca8;
  short sStack_ca6;
  short sStack_ca4;
  short sStack_ca2;
  short sStack_ca0;
  short sStack_c9e;
  short sStack_c9c;
  short sStack_c9a;
  short local_c88;
  short sStack_c86;
  short sStack_c84;
  short sStack_c82;
  short sStack_c80;
  short sStack_c7e;
  short sStack_c7c;
  short sStack_c7a;
  short local_c68;
  short sStack_c66;
  short sStack_c64;
  short sStack_c62;
  short sStack_c60;
  short sStack_c5e;
  short sStack_c5c;
  short sStack_c5a;
  short local_c48;
  short sStack_c46;
  short sStack_c44;
  short sStack_c42;
  short sStack_c40;
  short sStack_c3e;
  short sStack_c3c;
  short sStack_c3a;
  undefined2 local_9f8;
  undefined2 uStack_9f6;
  undefined2 uStack_9f4;
  undefined2 uStack_9f2;
  undefined2 local_9e8;
  undefined2 uStack_9e6;
  undefined2 uStack_9e4;
  undefined2 uStack_9e2;
  undefined2 local_9d8;
  undefined2 uStack_9d4;
  undefined2 local_9c8;
  undefined2 uStack_9c4;
  undefined2 uStack_9b6;
  undefined2 uStack_9b2;
  undefined2 uStack_9a6;
  undefined2 uStack_9a2;
  undefined2 local_978;
  undefined2 uStack_976;
  undefined2 uStack_974;
  undefined2 uStack_972;
  undefined2 local_968;
  undefined2 uStack_966;
  undefined2 uStack_964;
  undefined2 uStack_962;
  undefined2 local_958;
  undefined2 uStack_956;
  undefined2 uStack_954;
  undefined2 uStack_952;
  undefined2 local_948;
  undefined2 uStack_946;
  undefined2 uStack_944;
  undefined2 uStack_942;
  undefined4 uStack_444;
  undefined4 uStack_404;
  undefined4 uStack_3f4;
  undefined4 uStack_3dc;
  undefined4 uStack_39c;
  undefined4 uStack_38c;
  undefined4 uStack_340;
  undefined4 uStack_330;
  undefined4 uStack_320;
  undefined4 uStack_310;
  __m128i src_temp18_8x16b;
  __m128i src_temp17_8x16b;
  __m128i src_temp16_8x16b;
  __m128i src_temp15_8x16b;
  __m128i src_temp14_8x16b;
  
  local_1668 = (short)gai4_ihevc_ang_table[in_R9D];
  if (in_R8D == 4) {
    sVar73 = (short)in_R8D * 4 + -2;
    uVar77 = CONCAT26(local_1668 * 4,CONCAT24(local_1668 * 3,CONCAT22(local_1668 * 2,local_1668))) &
             0x1f001f001f001f;
    auVar39._2_2_ = local_1668 * 2;
    auVar39._0_2_ = local_1668;
    auVar39._4_2_ = local_1668 * 3;
    auVar39._6_2_ = local_1668 * 4;
    auVar39._10_2_ = local_1668 * 6;
    auVar39._8_2_ = local_1668 * 5;
    auVar39._12_2_ = local_1668 * 7;
    auVar39._14_2_ = local_1668 * 8;
    auVar78 = psraw(auVar39,ZEXT416(5));
    local_1128 = auVar78._0_2_;
    sStack_1126 = auVar78._2_2_;
    sStack_1124 = auVar78._4_2_;
    sStack_1122 = auVar78._6_2_;
    cVar65 = (char)uVar77;
    local_1758 = ' ' - cVar65;
    cVar66 = (char)(uVar77 >> 0x10);
    cStack_1756 = ' ' - cVar66;
    cVar67 = (char)(uVar77 >> 0x20);
    cStack_1754 = ' ' - cVar67;
    cVar68 = (char)(uVar77 >> 0x30);
    cStack_1752 = ' ' - cVar68;
    auVar59[1] = cVar65;
    auVar59[0] = local_1758;
    auVar59[2] = local_1758;
    auVar59[3] = cVar65;
    auVar59[4] = local_1758;
    auVar59[5] = cVar65;
    auVar59[6] = local_1758;
    auVar59[7] = cVar65;
    uStack_17b0 = CONCAT17(cVar65,CONCAT16(local_1758,
                                           CONCAT15(cVar65,CONCAT14(local_1758,
                                                                    CONCAT13(cVar65,CONCAT12(
                                                  local_1758,CONCAT11(cVar65,local_1758)))))));
    auVar57[1] = cVar66;
    auVar57[0] = cStack_1756;
    auVar57[2] = cStack_1756;
    auVar57[3] = cVar66;
    auVar57[4] = cStack_1756;
    auVar57[5] = cVar66;
    auVar57[6] = cStack_1756;
    auVar57[7] = cVar66;
    uStack_17c0 = CONCAT17(cVar66,CONCAT16(cStack_1756,
                                           CONCAT15(cVar66,CONCAT14(cStack_1756,
                                                                    CONCAT13(cVar66,CONCAT12(
                                                  cStack_1756,CONCAT11(cVar66,cStack_1756)))))));
    auVar55[1] = cVar67;
    auVar55[0] = cStack_1754;
    auVar55[2] = cStack_1754;
    auVar55[3] = cVar67;
    auVar55[4] = cStack_1754;
    auVar55[5] = cVar67;
    auVar55[6] = cStack_1754;
    auVar55[7] = cVar67;
    uStack_17d0 = CONCAT17(cVar67,CONCAT16(cStack_1754,
                                           CONCAT15(cVar67,CONCAT14(cStack_1754,
                                                                    CONCAT13(cVar67,CONCAT12(
                                                  cStack_1754,CONCAT11(cVar67,cStack_1754)))))));
    auVar53[1] = cVar68;
    auVar53[0] = cStack_1752;
    auVar53[2] = cStack_1752;
    auVar53[3] = cVar68;
    auVar53[4] = cStack_1752;
    auVar53[5] = cVar68;
    auVar53[6] = cStack_1752;
    auVar53[7] = cVar68;
    uStack_17e0 = CONCAT17(cVar68,CONCAT16(cStack_1752,
                                           CONCAT15(cVar68,CONCAT14(cStack_1752,
                                                                    CONCAT13(cVar68,CONCAT12(
                                                  cStack_1752,CONCAT11(cVar68,cStack_1752)))))));
    pVar74 = (unkbyte10 *)(in_RDI + -8 + (long)(short)(sVar73 + local_1128 * -2));
    uVar1 = *(undefined8 *)pVar74;
    Var61 = *pVar74;
    pVar74 = (unkbyte10 *)(in_RDI + -8 + (long)(short)(sVar73 + sStack_1126 * -2));
    uVar2 = *(undefined8 *)pVar74;
    Var62 = *pVar74;
    pauVar75 = (undefined1 (*) [12])(in_RDI + -8 + (long)(short)(sVar73 + sStack_1124 * -2));
    uVar3 = *(undefined8 *)*pauVar75;
    auVar63 = *pauVar75;
    pauVar75 = (undefined1 (*) [12])(in_RDI + -8 + (long)(short)(sVar73 + sStack_1122 * -2));
    uVar4 = *(undefined8 *)*pauVar75;
    auVar64 = *pauVar75;
    local_e48 = (undefined1)((unkuint10)Var61 >> 0x10);
    uStack_e47 = (undefined1)((unkuint10)Var61 >> 0x18);
    uStack_e46 = (undefined1)((unkuint10)Var61 >> 0x20);
    uStack_e45 = (undefined1)((unkuint10)Var61 >> 0x28);
    uStack_e44 = (undefined1)((unkuint10)Var61 >> 0x30);
    uStack_e43 = (undefined1)((unkuint10)Var61 >> 0x38);
    uStack_e42 = (undefined1)((unkuint10)Var61 >> 0x40);
    uStack_e41 = (undefined1)((unkuint10)Var61 >> 0x48);
    local_e58 = (undefined1)uVar1;
    uStack_e57 = (undefined1)((ulong)uVar1 >> 8);
    uStack_e56 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_e55 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_e54 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_e53 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_e52 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_e51 = (undefined1)((ulong)uVar1 >> 0x38);
    local_17f8._0_2_ = CONCAT11(local_e58,local_e48);
    local_17f8._0_3_ = CONCAT12(uStack_e47,(undefined2)local_17f8);
    local_17f8._0_4_ = CONCAT13(uStack_e57,(undefined3)local_17f8);
    local_17f8._0_5_ = CONCAT14(uStack_e46,(undefined4)local_17f8);
    local_17f8._0_6_ = CONCAT15(uStack_e56,(undefined5)local_17f8);
    local_17f8._0_7_ = CONCAT16(uStack_e45,(undefined6)local_17f8);
    local_17f8 = CONCAT17(uStack_e55,(undefined7)local_17f8);
    uStack_17f0._0_1_ = uStack_e44;
    uStack_17f0._1_1_ = uStack_e54;
    uStack_17f0._2_1_ = uStack_e43;
    uStack_17f0._3_1_ = uStack_e53;
    uStack_17f0._4_1_ = uStack_e42;
    uStack_17f0._5_1_ = uStack_e52;
    uStack_17f0._6_1_ = uStack_e41;
    uStack_17f0._7_1_ = uStack_e51;
    local_e68 = (undefined1)((unkuint10)Var62 >> 0x10);
    uStack_e67 = (undefined1)((unkuint10)Var62 >> 0x18);
    uStack_e66 = (undefined1)((unkuint10)Var62 >> 0x20);
    uStack_e65 = (undefined1)((unkuint10)Var62 >> 0x28);
    uStack_e64 = (undefined1)((unkuint10)Var62 >> 0x30);
    uStack_e63 = (undefined1)((unkuint10)Var62 >> 0x38);
    uStack_e62 = (undefined1)((unkuint10)Var62 >> 0x40);
    uStack_e61 = (undefined1)((unkuint10)Var62 >> 0x48);
    local_e78 = (undefined1)uVar2;
    uStack_e77 = (undefined1)((ulong)uVar2 >> 8);
    uStack_e76 = (undefined1)((ulong)uVar2 >> 0x10);
    uStack_e75 = (undefined1)((ulong)uVar2 >> 0x18);
    uStack_e74 = (undefined1)((ulong)uVar2 >> 0x20);
    uStack_e73 = (undefined1)((ulong)uVar2 >> 0x28);
    uStack_e72 = (undefined1)((ulong)uVar2 >> 0x30);
    uStack_e71 = (undefined1)((ulong)uVar2 >> 0x38);
    local_1808._0_2_ = CONCAT11(local_e78,local_e68);
    local_1808._0_3_ = CONCAT12(uStack_e67,(undefined2)local_1808);
    local_1808._0_4_ = CONCAT13(uStack_e77,(undefined3)local_1808);
    local_1808._0_5_ = CONCAT14(uStack_e66,(undefined4)local_1808);
    local_1808._0_6_ = CONCAT15(uStack_e76,(undefined5)local_1808);
    local_1808._0_7_ = CONCAT16(uStack_e65,(undefined6)local_1808);
    local_1808 = CONCAT17(uStack_e75,(undefined7)local_1808);
    uStack_1800._0_1_ = uStack_e64;
    uStack_1800._1_1_ = uStack_e74;
    uStack_1800._2_1_ = uStack_e63;
    uStack_1800._3_1_ = uStack_e73;
    uStack_1800._4_1_ = uStack_e62;
    uStack_1800._5_1_ = uStack_e72;
    uStack_1800._6_1_ = uStack_e61;
    uStack_1800._7_1_ = uStack_e71;
    local_e88 = auVar63[2];
    uStack_e87 = auVar63[3];
    uStack_e86 = auVar63[4];
    uStack_e85 = auVar63[5];
    uStack_e84 = auVar63[6];
    uStack_e83 = auVar63[7];
    uStack_e82 = auVar63[8];
    uStack_e81 = auVar63[9];
    local_e98 = (undefined1)uVar3;
    uStack_e97 = (undefined1)((ulong)uVar3 >> 8);
    uStack_e96 = (undefined1)((ulong)uVar3 >> 0x10);
    uStack_e95 = (undefined1)((ulong)uVar3 >> 0x18);
    uStack_e94 = (undefined1)((ulong)uVar3 >> 0x20);
    uStack_e93 = (undefined1)((ulong)uVar3 >> 0x28);
    uStack_e92 = (undefined1)((ulong)uVar3 >> 0x30);
    uStack_e91 = (undefined1)((ulong)uVar3 >> 0x38);
    local_1818._0_2_ = CONCAT11(local_e98,local_e88);
    local_1818._0_3_ = CONCAT12(uStack_e87,(undefined2)local_1818);
    local_1818._0_4_ = CONCAT13(uStack_e97,(undefined3)local_1818);
    local_1818._0_5_ = CONCAT14(uStack_e86,(undefined4)local_1818);
    local_1818._0_6_ = CONCAT15(uStack_e96,(undefined5)local_1818);
    local_1818._0_7_ = CONCAT16(uStack_e85,(undefined6)local_1818);
    local_1818 = CONCAT17(uStack_e95,(undefined7)local_1818);
    uStack_1810._0_1_ = uStack_e84;
    uStack_1810._1_1_ = uStack_e94;
    uStack_1810._2_1_ = uStack_e83;
    uStack_1810._3_1_ = uStack_e93;
    uStack_1810._4_1_ = uStack_e82;
    uStack_1810._5_1_ = uStack_e92;
    uStack_1810._6_1_ = uStack_e81;
    uStack_1810._7_1_ = uStack_e91;
    local_ea8 = auVar64[2];
    uStack_ea7 = auVar64[3];
    uStack_ea6 = auVar64[4];
    uStack_ea5 = auVar64[5];
    uStack_ea4 = auVar64[6];
    uStack_ea3 = auVar64[7];
    uStack_ea2 = auVar64[8];
    uStack_ea1 = auVar64[9];
    local_eb8 = (undefined1)uVar4;
    uStack_eb7 = (undefined1)((ulong)uVar4 >> 8);
    uStack_eb6 = (undefined1)((ulong)uVar4 >> 0x10);
    uStack_eb5 = (undefined1)((ulong)uVar4 >> 0x18);
    uStack_eb4 = (undefined1)((ulong)uVar4 >> 0x20);
    uStack_eb3 = (undefined1)((ulong)uVar4 >> 0x28);
    uStack_eb2 = (undefined1)((ulong)uVar4 >> 0x30);
    uStack_eb1 = (undefined1)((ulong)uVar4 >> 0x38);
    local_1828._0_2_ = CONCAT11(local_eb8,local_ea8);
    local_1828._0_3_ = CONCAT12(uStack_ea7,(undefined2)local_1828);
    local_1828._0_4_ = CONCAT13(uStack_eb7,(undefined3)local_1828);
    local_1828._0_5_ = CONCAT14(uStack_ea6,(undefined4)local_1828);
    local_1828._0_6_ = CONCAT15(uStack_eb6,(undefined5)local_1828);
    local_1828._0_7_ = CONCAT16(uStack_ea5,(undefined6)local_1828);
    local_1828 = CONCAT17(uStack_eb5,(undefined7)local_1828);
    uStack_1820._0_1_ = uStack_ea4;
    uStack_1820._1_1_ = uStack_eb4;
    uStack_1820._2_1_ = uStack_ea3;
    uStack_1820._3_1_ = uStack_eb3;
    uStack_1820._4_1_ = uStack_ea2;
    uStack_1820._5_1_ = uStack_eb2;
    uStack_1820._6_1_ = uStack_ea1;
    uStack_1820._7_1_ = uStack_eb1;
    auVar60._8_8_ = uStack_17f0;
    auVar60._0_8_ = local_17f8;
    auVar59._8_8_ = uStack_17b0;
    auVar78 = pmaddubsw(auVar60,auVar59);
    auVar58._8_8_ = uStack_1800;
    auVar58._0_8_ = local_1808;
    auVar57._8_8_ = uStack_17c0;
    auVar79 = pmaddubsw(auVar58,auVar57);
    auVar56._8_8_ = uStack_1810;
    auVar56._0_8_ = local_1818;
    auVar55._8_8_ = uStack_17d0;
    auVar80 = pmaddubsw(auVar56,auVar55);
    auVar54._8_8_ = uStack_1820;
    auVar54._0_8_ = local_1828;
    auVar53._8_8_ = uStack_17e0;
    auVar81 = pmaddubsw(auVar54,auVar53);
    local_1168 = auVar78._0_2_;
    sStack_1166 = auVar78._2_2_;
    sStack_1164 = auVar78._4_2_;
    sStack_1162 = auVar78._6_2_;
    sStack_1160 = auVar78._8_2_;
    sStack_115e = auVar78._10_2_;
    sStack_115c = auVar78._12_2_;
    sStack_115a = auVar78._14_2_;
    local_17f8._0_4_ = CONCAT22(sStack_1166 + 0x10,local_1168 + 0x10);
    local_17f8._0_6_ = CONCAT24(sStack_1164 + 0x10,(undefined4)local_17f8);
    local_17f8 = CONCAT26(sStack_1162 + 0x10,(undefined6)local_17f8);
    uStack_17f0._0_2_ = sStack_1160 + 0x10;
    uStack_17f0._2_2_ = sStack_115e + 0x10;
    uStack_17f0._4_2_ = sStack_115c + 0x10;
    uStack_17f0._6_2_ = sStack_115a + 0x10;
    local_1188 = auVar79._0_2_;
    sStack_1186 = auVar79._2_2_;
    sStack_1184 = auVar79._4_2_;
    sStack_1182 = auVar79._6_2_;
    sStack_1180 = auVar79._8_2_;
    sStack_117e = auVar79._10_2_;
    sStack_117c = auVar79._12_2_;
    sStack_117a = auVar79._14_2_;
    local_1808._0_4_ = CONCAT22(sStack_1186 + 0x10,local_1188 + 0x10);
    local_1808._0_6_ = CONCAT24(sStack_1184 + 0x10,(undefined4)local_1808);
    local_1808 = CONCAT26(sStack_1182 + 0x10,(undefined6)local_1808);
    uStack_1800._0_2_ = sStack_1180 + 0x10;
    uStack_1800._2_2_ = sStack_117e + 0x10;
    uStack_1800._4_2_ = sStack_117c + 0x10;
    uStack_1800._6_2_ = sStack_117a + 0x10;
    local_11a8 = auVar80._0_2_;
    sStack_11a6 = auVar80._2_2_;
    sStack_11a4 = auVar80._4_2_;
    sStack_11a2 = auVar80._6_2_;
    sStack_11a0 = auVar80._8_2_;
    sStack_119e = auVar80._10_2_;
    sStack_119c = auVar80._12_2_;
    sStack_119a = auVar80._14_2_;
    local_1818._0_4_ = CONCAT22(sStack_11a6 + 0x10,local_11a8 + 0x10);
    local_1818._0_6_ = CONCAT24(sStack_11a4 + 0x10,(undefined4)local_1818);
    local_1818 = CONCAT26(sStack_11a2 + 0x10,(undefined6)local_1818);
    uStack_1810._0_2_ = sStack_11a0 + 0x10;
    uStack_1810._2_2_ = sStack_119e + 0x10;
    uStack_1810._4_2_ = sStack_119c + 0x10;
    uStack_1810._6_2_ = sStack_119a + 0x10;
    local_11c8 = auVar81._0_2_;
    sStack_11c6 = auVar81._2_2_;
    sStack_11c4 = auVar81._4_2_;
    sStack_11c2 = auVar81._6_2_;
    sStack_11c0 = auVar81._8_2_;
    sStack_11be = auVar81._10_2_;
    sStack_11bc = auVar81._12_2_;
    sStack_11ba = auVar81._14_2_;
    local_1828._0_4_ = CONCAT22(sStack_11c6 + 0x10,local_11c8 + 0x10);
    local_1828._0_6_ = CONCAT24(sStack_11c4 + 0x10,(undefined4)local_1828);
    local_1828 = CONCAT26(sStack_11c2 + 0x10,(undefined6)local_1828);
    uStack_1820._0_2_ = sStack_11c0 + 0x10;
    uStack_1820._2_2_ = sStack_11be + 0x10;
    uStack_1820._4_2_ = sStack_11bc + 0x10;
    uStack_1820._6_2_ = sStack_11ba + 0x10;
    auVar38._8_8_ = uStack_17f0;
    auVar38._0_8_ = local_17f8;
    auVar78 = psraw(auVar38,ZEXT416(5));
    auVar37._8_8_ = uStack_1800;
    auVar37._0_8_ = local_1808;
    auVar79 = psraw(auVar37,ZEXT416(5));
    auVar36._8_8_ = uStack_1810;
    auVar36._0_8_ = local_1818;
    auVar80 = psraw(auVar36,ZEXT416(5));
    auVar35._8_8_ = uStack_1820;
    auVar35._0_8_ = local_1828;
    auVar81 = psraw(auVar35,ZEXT416(5));
    local_c48 = auVar78._0_2_;
    sStack_c46 = auVar78._2_2_;
    sStack_c44 = auVar78._4_2_;
    sStack_c42 = auVar78._6_2_;
    sStack_c40 = auVar78._8_2_;
    sStack_c3e = auVar78._10_2_;
    sStack_c3c = auVar78._12_2_;
    sStack_c3a = auVar78._14_2_;
    local_17f8._0_2_ =
         CONCAT11((0 < sStack_c46) * (sStack_c46 < 0x100) * auVar78[2] - (0xff < sStack_c46),
                  (0 < local_c48) * (local_c48 < 0x100) * auVar78[0] - (0xff < local_c48));
    local_17f8._0_3_ =
         CONCAT12((0 < sStack_c44) * (sStack_c44 < 0x100) * auVar78[4] - (0xff < sStack_c44),
                  (undefined2)local_17f8);
    local_17f8._0_4_ =
         CONCAT13((0 < sStack_c42) * (sStack_c42 < 0x100) * auVar78[6] - (0xff < sStack_c42),
                  (undefined3)local_17f8);
    local_17f8._0_5_ =
         CONCAT14((0 < sStack_c40) * (sStack_c40 < 0x100) * auVar78[8] - (0xff < sStack_c40),
                  (undefined4)local_17f8);
    local_17f8._0_6_ =
         CONCAT15((0 < sStack_c3e) * (sStack_c3e < 0x100) * auVar78[10] - (0xff < sStack_c3e),
                  (undefined5)local_17f8);
    local_17f8._0_7_ =
         CONCAT16((0 < sStack_c3c) * (sStack_c3c < 0x100) * auVar78[0xc] - (0xff < sStack_c3c),
                  (undefined6)local_17f8);
    local_17f8 = CONCAT17((0 < sStack_c3a) * (sStack_c3a < 0x100) * auVar78[0xe] -
                          (0xff < sStack_c3a),(undefined7)local_17f8);
    local_c68 = auVar79._0_2_;
    sStack_c66 = auVar79._2_2_;
    sStack_c64 = auVar79._4_2_;
    sStack_c62 = auVar79._6_2_;
    sStack_c60 = auVar79._8_2_;
    sStack_c5e = auVar79._10_2_;
    sStack_c5c = auVar79._12_2_;
    sStack_c5a = auVar79._14_2_;
    local_1808._0_2_ =
         CONCAT11((0 < sStack_c66) * (sStack_c66 < 0x100) * auVar79[2] - (0xff < sStack_c66),
                  (0 < local_c68) * (local_c68 < 0x100) * auVar79[0] - (0xff < local_c68));
    local_1808._0_3_ =
         CONCAT12((0 < sStack_c64) * (sStack_c64 < 0x100) * auVar79[4] - (0xff < sStack_c64),
                  (undefined2)local_1808);
    local_1808._0_4_ =
         CONCAT13((0 < sStack_c62) * (sStack_c62 < 0x100) * auVar79[6] - (0xff < sStack_c62),
                  (undefined3)local_1808);
    local_1808._0_5_ =
         CONCAT14((0 < sStack_c60) * (sStack_c60 < 0x100) * auVar79[8] - (0xff < sStack_c60),
                  (undefined4)local_1808);
    local_1808._0_6_ =
         CONCAT15((0 < sStack_c5e) * (sStack_c5e < 0x100) * auVar79[10] - (0xff < sStack_c5e),
                  (undefined5)local_1808);
    local_1808._0_7_ =
         CONCAT16((0 < sStack_c5c) * (sStack_c5c < 0x100) * auVar79[0xc] - (0xff < sStack_c5c),
                  (undefined6)local_1808);
    local_1808 = CONCAT17((0 < sStack_c5a) * (sStack_c5a < 0x100) * auVar79[0xe] -
                          (0xff < sStack_c5a),(undefined7)local_1808);
    local_c88 = auVar80._0_2_;
    sStack_c86 = auVar80._2_2_;
    sStack_c84 = auVar80._4_2_;
    sStack_c82 = auVar80._6_2_;
    sStack_c80 = auVar80._8_2_;
    sStack_c7e = auVar80._10_2_;
    sStack_c7c = auVar80._12_2_;
    sStack_c7a = auVar80._14_2_;
    local_1818._0_2_ =
         CONCAT11((0 < sStack_c86) * (sStack_c86 < 0x100) * auVar80[2] - (0xff < sStack_c86),
                  (0 < local_c88) * (local_c88 < 0x100) * auVar80[0] - (0xff < local_c88));
    local_1818._0_3_ =
         CONCAT12((0 < sStack_c84) * (sStack_c84 < 0x100) * auVar80[4] - (0xff < sStack_c84),
                  (undefined2)local_1818);
    local_1818._0_4_ =
         CONCAT13((0 < sStack_c82) * (sStack_c82 < 0x100) * auVar80[6] - (0xff < sStack_c82),
                  (undefined3)local_1818);
    local_1818._0_5_ =
         CONCAT14((0 < sStack_c80) * (sStack_c80 < 0x100) * auVar80[8] - (0xff < sStack_c80),
                  (undefined4)local_1818);
    local_1818._0_6_ =
         CONCAT15((0 < sStack_c7e) * (sStack_c7e < 0x100) * auVar80[10] - (0xff < sStack_c7e),
                  (undefined5)local_1818);
    local_1818._0_7_ =
         CONCAT16((0 < sStack_c7c) * (sStack_c7c < 0x100) * auVar80[0xc] - (0xff < sStack_c7c),
                  (undefined6)local_1818);
    local_1818 = CONCAT17((0 < sStack_c7a) * (sStack_c7a < 0x100) * auVar80[0xe] -
                          (0xff < sStack_c7a),(undefined7)local_1818);
    local_ca8 = auVar81._0_2_;
    sStack_ca6 = auVar81._2_2_;
    sStack_ca4 = auVar81._4_2_;
    sStack_ca2 = auVar81._6_2_;
    sStack_ca0 = auVar81._8_2_;
    sStack_c9e = auVar81._10_2_;
    sStack_c9c = auVar81._12_2_;
    sStack_c9a = auVar81._14_2_;
    local_1828._0_2_ =
         CONCAT11((0 < sStack_ca6) * (sStack_ca6 < 0x100) * auVar81[2] - (0xff < sStack_ca6),
                  (0 < local_ca8) * (local_ca8 < 0x100) * auVar81[0] - (0xff < local_ca8));
    local_1828._0_3_ =
         CONCAT12((0 < sStack_ca4) * (sStack_ca4 < 0x100) * auVar81[4] - (0xff < sStack_ca4),
                  (undefined2)local_1828);
    local_1828._0_4_ =
         CONCAT13((0 < sStack_ca2) * (sStack_ca2 < 0x100) * auVar81[6] - (0xff < sStack_ca2),
                  (undefined3)local_1828);
    local_1828._0_5_ =
         CONCAT14((0 < sStack_ca0) * (sStack_ca0 < 0x100) * auVar81[8] - (0xff < sStack_ca0),
                  (undefined4)local_1828);
    local_1828._0_6_ =
         CONCAT15((0 < sStack_c9e) * (sStack_c9e < 0x100) * auVar81[10] - (0xff < sStack_c9e),
                  (undefined5)local_1828);
    local_1828._0_7_ =
         CONCAT16((0 < sStack_c9c) * (sStack_c9c < 0x100) * auVar81[0xc] - (0xff < sStack_c9c),
                  (undefined6)local_1828);
    local_1828 = CONCAT17((0 < sStack_c9a) * (sStack_c9a < 0x100) * auVar81[0xe] -
                          (0xff < sStack_c9a),(undefined7)local_1828);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_17f8;
    auVar25[8] = '\b';
    auVar25[9] = '\b';
    auVar25[10] = '\b';
    auVar25[0xb] = '\b';
    auVar25[0xc] = '\b';
    auVar25[0xd] = '\b';
    auVar25[0xe] = '\b';
    auVar25[0xf] = '\b';
    auVar25[0] = '\x06';
    auVar25[1] = '\a';
    auVar25[2] = '\x04';
    auVar25[3] = '\x05';
    auVar25[4] = '\x02';
    auVar25[5] = '\x03';
    auVar25[6] = '\0';
    auVar25[7] = '\x01';
    auVar78 = pshufb(auVar26,auVar25);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_1808;
    auVar23[8] = '\b';
    auVar23[9] = '\b';
    auVar23[10] = '\b';
    auVar23[0xb] = '\b';
    auVar23[0xc] = '\b';
    auVar23[0xd] = '\b';
    auVar23[0xe] = '\b';
    auVar23[0xf] = '\b';
    auVar23[0] = '\x06';
    auVar23[1] = '\a';
    auVar23[2] = '\x04';
    auVar23[3] = '\x05';
    auVar23[4] = '\x02';
    auVar23[5] = '\x03';
    auVar23[6] = '\0';
    auVar23[7] = '\x01';
    auVar79 = pshufb(auVar24,auVar23);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_1818;
    auVar21[8] = '\b';
    auVar21[9] = '\b';
    auVar21[10] = '\b';
    auVar21[0xb] = '\b';
    auVar21[0xc] = '\b';
    auVar21[0xd] = '\b';
    auVar21[0xe] = '\b';
    auVar21[0xf] = '\b';
    auVar21[0] = '\x06';
    auVar21[1] = '\a';
    auVar21[2] = '\x04';
    auVar21[3] = '\x05';
    auVar21[4] = '\x02';
    auVar21[5] = '\x03';
    auVar21[6] = '\0';
    auVar21[7] = '\x01';
    auVar80 = pshufb(auVar22,auVar21);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_1828;
    auVar19[8] = '\b';
    auVar19[9] = '\b';
    auVar19[10] = '\b';
    auVar19[0xb] = '\b';
    auVar19[0xc] = '\b';
    auVar19[0xd] = '\b';
    auVar19[0xe] = '\b';
    auVar19[0xf] = '\b';
    auVar19[0] = '\x06';
    auVar19[1] = '\a';
    auVar19[2] = '\x04';
    auVar19[3] = '\x05';
    auVar19[4] = '\x02';
    auVar19[5] = '\x03';
    auVar19[6] = '\0';
    auVar19[7] = '\x01';
    auVar81 = pshufb(auVar20,auVar19);
    local_948 = auVar78._0_2_;
    uStack_946 = auVar78._2_2_;
    uStack_944 = auVar78._4_2_;
    uStack_942 = auVar78._6_2_;
    local_958 = auVar79._0_2_;
    uStack_956 = auVar79._2_2_;
    uStack_954 = auVar79._4_2_;
    uStack_952 = auVar79._6_2_;
    local_968 = auVar80._0_2_;
    uStack_966 = auVar80._2_2_;
    uStack_964 = auVar80._4_2_;
    uStack_962 = auVar80._6_2_;
    local_978 = auVar81._0_2_;
    uStack_976 = auVar81._2_2_;
    uStack_974 = auVar81._4_2_;
    uStack_972 = auVar81._6_2_;
    uVar9 = CONCAT22(local_958,local_948);
    uVar7 = CONCAT22(local_978,local_968);
    uStack_3f4 = (undefined4)(CONCAT26(uStack_956,CONCAT24(uStack_946,uVar9)) >> 0x20);
    uStack_404 = (undefined4)(CONCAT26(uStack_976,CONCAT24(uStack_966,uVar7)) >> 0x20);
    uVar10 = CONCAT22(uStack_954,uStack_944);
    uVar8 = CONCAT22(uStack_974,uStack_964);
    uStack_38c = (undefined4)(CONCAT26(uStack_952,CONCAT24(uStack_942,uVar10)) >> 0x20);
    uStack_39c = (undefined4)(CONCAT26(uStack_972,CONCAT24(uStack_962,uVar8)) >> 0x20);
    *in_RDX = CONCAT44(uVar7,uVar9);
    auVar5._4_4_ = uVar7;
    auVar5._0_4_ = uVar9;
    auVar5._8_4_ = uStack_3f4;
    auVar5._12_4_ = uStack_404;
    *(long *)((long)in_RDX + (long)in_ECX) = auVar5._8_8_;
    *(ulong *)((long)in_RDX + (long)(in_ECX * 2)) = CONCAT44(uVar8,uVar10);
    auVar6._4_4_ = uVar8;
    auVar6._0_4_ = uVar10;
    auVar6._8_4_ = uStack_38c;
    auVar6._12_4_ = uStack_39c;
    *(long *)((long)in_RDX + (long)(in_ECX * 3)) = auVar6._8_8_;
  }
  else {
    local_16e8 = 0x4000300020001;
    uStack_16e0 = 0x8000700060005;
    sVar73 = (short)in_R8D * 4 + -2;
    for (local_1664 = 0; SBORROW4(local_1664,in_R8D * 2) != local_1664 + in_R8D * -2 < 0;
        local_1664 = local_1664 + 0x10) {
      local_1348 = (short)local_16e8;
      sStack_1346 = (short)((ulong)local_16e8 >> 0x10);
      sStack_1344 = (short)((ulong)local_16e8 >> 0x20);
      sStack_1342 = (short)((ulong)local_16e8 >> 0x30);
      sStack_1340 = (short)uStack_16e0;
      sStack_133e = (short)((ulong)uStack_16e0 >> 0x10);
      sStack_133c = (short)((ulong)uStack_16e0 >> 0x20);
      sStack_133a = (short)((ulong)uStack_16e0 >> 0x30);
      uVar77 = CONCAT26(sStack_1342 * local_1668,
                        CONCAT24(sStack_1344 * local_1668,
                                 CONCAT22(sStack_1346 * local_1668,local_1348 * local_1668))) &
               0x1f001f001f001f;
      uVar90 = CONCAT26(sStack_133a * local_1668,
                        CONCAT24(sStack_133c * local_1668,
                                 CONCAT22(sStack_133e * local_1668,sStack_1340 * local_1668))) &
               0x1f001f001f001f;
      auVar78._2_2_ = sStack_1346 * local_1668;
      auVar78._0_2_ = local_1348 * local_1668;
      auVar78._4_2_ = sStack_1344 * local_1668;
      auVar78._6_2_ = sStack_1342 * local_1668;
      auVar78._10_2_ = sStack_133e * local_1668;
      auVar78._8_2_ = sStack_1340 * local_1668;
      auVar78._12_2_ = sStack_133c * local_1668;
      auVar78._14_2_ = sStack_133a * local_1668;
      auVar78 = psraw(auVar78,ZEXT416(5));
      local_11e8 = auVar78._0_2_;
      sStack_11e6 = auVar78._2_2_;
      sStack_11e4 = auVar78._4_2_;
      sStack_11e2 = auVar78._6_2_;
      sStack_11e0 = auVar78._8_2_;
      sStack_11de = auVar78._10_2_;
      sStack_11dc = auVar78._12_2_;
      sStack_11da = auVar78._14_2_;
      local_16e8 = CONCAT26(sStack_1342 + 8,
                            CONCAT24(sStack_1344 + 8,CONCAT22(sStack_1346 + 8,local_1348 + 8)));
      uStack_16e0 = CONCAT26(sStack_133a + 8,
                             CONCAT24(sStack_133c + 8,CONCAT22(sStack_133e + 8,sStack_1340 + 8)));
      cVar65 = (char)uVar77;
      local_1898 = ' ' - cVar65;
      cVar66 = (char)(uVar77 >> 0x10);
      cStack_1896 = ' ' - cVar66;
      cVar67 = (char)(uVar77 >> 0x20);
      cStack_1894 = ' ' - cVar67;
      cVar68 = (char)(uVar77 >> 0x30);
      cStack_1892 = ' ' - cVar68;
      cVar69 = (char)uVar90;
      cStack_1890 = ' ' - cVar69;
      cVar70 = (char)(uVar90 >> 0x10);
      cStack_188e = ' ' - cVar70;
      cVar71 = (char)(uVar90 >> 0x20);
      cStack_188c = ' ' - cVar71;
      cVar72 = (char)(uVar90 >> 0x30);
      cStack_188a = ' ' - cVar72;
      auVar51[1] = cVar65;
      auVar51[0] = local_1898;
      auVar51[2] = local_1898;
      auVar51[3] = cVar65;
      auVar51[4] = local_1898;
      auVar51[5] = cVar65;
      auVar51[6] = local_1898;
      auVar51[7] = cVar65;
      uStack_1930 = CONCAT17(cVar65,CONCAT16(local_1898,
                                             CONCAT15(cVar65,CONCAT14(local_1898,
                                                                      CONCAT13(cVar65,CONCAT12(
                                                  local_1898,CONCAT11(cVar65,local_1898)))))));
      auVar49[1] = cVar66;
      auVar49[0] = cStack_1896;
      auVar49[2] = cStack_1896;
      auVar49[3] = cVar66;
      auVar49[4] = cStack_1896;
      auVar49[5] = cVar66;
      auVar49[6] = cStack_1896;
      auVar49[7] = cVar66;
      uStack_1940 = CONCAT17(cVar66,CONCAT16(cStack_1896,
                                             CONCAT15(cVar66,CONCAT14(cStack_1896,
                                                                      CONCAT13(cVar66,CONCAT12(
                                                  cStack_1896,CONCAT11(cVar66,cStack_1896)))))));
      auVar47[1] = cVar67;
      auVar47[0] = cStack_1894;
      auVar47[2] = cStack_1894;
      auVar47[3] = cVar67;
      auVar47[4] = cStack_1894;
      auVar47[5] = cVar67;
      auVar47[6] = cStack_1894;
      auVar47[7] = cVar67;
      uStack_1950 = CONCAT17(cVar67,CONCAT16(cStack_1894,
                                             CONCAT15(cVar67,CONCAT14(cStack_1894,
                                                                      CONCAT13(cVar67,CONCAT12(
                                                  cStack_1894,CONCAT11(cVar67,cStack_1894)))))));
      auVar45[1] = cVar68;
      auVar45[0] = cStack_1892;
      auVar45[2] = cStack_1892;
      auVar45[3] = cVar68;
      auVar45[4] = cStack_1892;
      auVar45[5] = cVar68;
      auVar45[6] = cStack_1892;
      auVar45[7] = cVar68;
      uStack_1960 = CONCAT17(cVar68,CONCAT16(cStack_1892,
                                             CONCAT15(cVar68,CONCAT14(cStack_1892,
                                                                      CONCAT13(cVar68,CONCAT12(
                                                  cStack_1892,CONCAT11(cVar68,cStack_1892)))))));
      auVar43[1] = cVar69;
      auVar43[0] = cStack_1890;
      auVar43[2] = cStack_1890;
      auVar43[3] = cVar69;
      auVar43[4] = cStack_1890;
      auVar43[5] = cVar69;
      auVar43[6] = cStack_1890;
      auVar43[7] = cVar69;
      uStack_1970 = CONCAT17(cVar69,CONCAT16(cStack_1890,
                                             CONCAT15(cVar69,CONCAT14(cStack_1890,
                                                                      CONCAT13(cVar69,CONCAT12(
                                                  cStack_1890,CONCAT11(cVar69,cStack_1890)))))));
      auVar81[1] = cVar70;
      auVar81[0] = cStack_188e;
      auVar81[2] = cStack_188e;
      auVar81[3] = cVar70;
      auVar81[4] = cStack_188e;
      auVar81[5] = cVar70;
      auVar81[6] = cStack_188e;
      auVar81[7] = cVar70;
      uStack_1980 = CONCAT17(cVar70,CONCAT16(cStack_188e,
                                             CONCAT15(cVar70,CONCAT14(cStack_188e,
                                                                      CONCAT13(cVar70,CONCAT12(
                                                  cStack_188e,CONCAT11(cVar70,cStack_188e)))))));
      auVar80[1] = cVar71;
      auVar80[0] = cStack_188c;
      auVar80[2] = cStack_188c;
      auVar80[3] = cVar71;
      auVar80[4] = cStack_188c;
      auVar80[5] = cVar71;
      auVar80[6] = cStack_188c;
      auVar80[7] = cVar71;
      uStack_1990 = CONCAT17(cVar71,CONCAT16(cStack_188c,
                                             CONCAT15(cVar71,CONCAT14(cStack_188c,
                                                                      CONCAT13(cVar71,CONCAT12(
                                                  cStack_188c,CONCAT11(cVar71,cStack_188c)))))));
      auVar79[1] = cVar72;
      auVar79[0] = cStack_188a;
      auVar79[2] = cStack_188a;
      auVar79[3] = cVar72;
      auVar79[4] = cStack_188a;
      auVar79[5] = cVar72;
      auVar79[6] = cStack_188a;
      auVar79[7] = cVar72;
      uStack_19a0 = CONCAT17(cVar72,CONCAT16(cStack_188a,
                                             CONCAT15(cVar72,CONCAT14(cStack_188a,
                                                                      CONCAT13(cVar72,CONCAT12(
                                                  cStack_188a,CONCAT11(cVar72,cStack_188a)))))));
      for (local_1660 = 0; local_1660 < in_R8D; local_1660 = local_1660 + 4) {
        pVar74 = (unkbyte10 *)
                 (((in_RDI + (short)(sVar73 + local_11e8 * -2)) - (long)local_1660) -
                 (long)(local_1660 + 8));
        uVar1 = *(undefined8 *)pVar74;
        Var61 = *pVar74;
        pVar74 = (unkbyte10 *)
                 (((in_RDI + (short)(sVar73 + sStack_11e6 * -2)) - (long)local_1660) -
                 (long)(local_1660 + 8));
        uVar2 = *(undefined8 *)pVar74;
        Var62 = *pVar74;
        pauVar75 = (undefined1 (*) [12])
                   (((in_RDI + (short)(sVar73 + sStack_11e4 * -2)) - (long)local_1660) -
                   (long)(local_1660 + 8));
        uVar3 = *(undefined8 *)*pauVar75;
        auVar63 = *pauVar75;
        pauVar75 = (undefined1 (*) [12])
                   (((in_RDI + (short)(sVar73 + sStack_11e2 * -2)) - (long)local_1660) -
                   (long)(local_1660 + 8));
        uVar4 = *(undefined8 *)*pauVar75;
        auVar64 = *pauVar75;
        local_fc8 = (undefined1)((unkuint10)Var61 >> 0x10);
        uStack_fc7 = (undefined1)((unkuint10)Var61 >> 0x18);
        uStack_fc6 = (undefined1)((unkuint10)Var61 >> 0x20);
        uStack_fc5 = (undefined1)((unkuint10)Var61 >> 0x28);
        uStack_fc4 = (undefined1)((unkuint10)Var61 >> 0x30);
        uStack_fc3 = (undefined1)((unkuint10)Var61 >> 0x38);
        uStack_fc2 = (undefined1)((unkuint10)Var61 >> 0x40);
        uStack_fc1 = (undefined1)((unkuint10)Var61 >> 0x48);
        local_fd8 = (undefined1)uVar1;
        uStack_fd7 = (undefined1)((ulong)uVar1 >> 8);
        uStack_fd6 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_fd5 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_fd4 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_fd3 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_fd2 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_fd1 = (undefined1)((ulong)uVar1 >> 0x38);
        local_19b8._0_2_ = CONCAT11(local_fd8,local_fc8);
        local_19b8._0_3_ = CONCAT12(uStack_fc7,(undefined2)local_19b8);
        local_19b8._0_4_ = CONCAT13(uStack_fd7,(undefined3)local_19b8);
        local_19b8._0_5_ = CONCAT14(uStack_fc6,(undefined4)local_19b8);
        local_19b8._0_6_ = CONCAT15(uStack_fd6,(undefined5)local_19b8);
        local_19b8._0_7_ = CONCAT16(uStack_fc5,(undefined6)local_19b8);
        local_19b8 = CONCAT17(uStack_fd5,(undefined7)local_19b8);
        uStack_19b0._0_1_ = uStack_fc4;
        uStack_19b0._1_1_ = uStack_fd4;
        uStack_19b0._2_1_ = uStack_fc3;
        uStack_19b0._3_1_ = uStack_fd3;
        uStack_19b0._4_1_ = uStack_fc2;
        uStack_19b0._5_1_ = uStack_fd2;
        uStack_19b0._6_1_ = uStack_fc1;
        uStack_19b0._7_1_ = uStack_fd1;
        local_fe8 = (undefined1)((unkuint10)Var62 >> 0x10);
        uStack_fe7 = (undefined1)((unkuint10)Var62 >> 0x18);
        uStack_fe6 = (undefined1)((unkuint10)Var62 >> 0x20);
        uStack_fe5 = (undefined1)((unkuint10)Var62 >> 0x28);
        uStack_fe4 = (undefined1)((unkuint10)Var62 >> 0x30);
        uStack_fe3 = (undefined1)((unkuint10)Var62 >> 0x38);
        uStack_fe2 = (undefined1)((unkuint10)Var62 >> 0x40);
        uStack_fe1 = (undefined1)((unkuint10)Var62 >> 0x48);
        local_ff8 = (undefined1)uVar2;
        uStack_ff7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_ff6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_ff5 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_ff4 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_ff3 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_ff2 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_ff1 = (undefined1)((ulong)uVar2 >> 0x38);
        local_19c8._0_2_ = CONCAT11(local_ff8,local_fe8);
        local_19c8._0_3_ = CONCAT12(uStack_fe7,(undefined2)local_19c8);
        local_19c8._0_4_ = CONCAT13(uStack_ff7,(undefined3)local_19c8);
        local_19c8._0_5_ = CONCAT14(uStack_fe6,(undefined4)local_19c8);
        local_19c8._0_6_ = CONCAT15(uStack_ff6,(undefined5)local_19c8);
        local_19c8._0_7_ = CONCAT16(uStack_fe5,(undefined6)local_19c8);
        local_19c8 = CONCAT17(uStack_ff5,(undefined7)local_19c8);
        uStack_19c0._0_1_ = uStack_fe4;
        uStack_19c0._1_1_ = uStack_ff4;
        uStack_19c0._2_1_ = uStack_fe3;
        uStack_19c0._3_1_ = uStack_ff3;
        uStack_19c0._4_1_ = uStack_fe2;
        uStack_19c0._5_1_ = uStack_ff2;
        uStack_19c0._6_1_ = uStack_fe1;
        uStack_19c0._7_1_ = uStack_ff1;
        local_1008 = auVar63[2];
        uStack_1007 = auVar63[3];
        uStack_1006 = auVar63[4];
        uStack_1005 = auVar63[5];
        uStack_1004 = auVar63[6];
        uStack_1003 = auVar63[7];
        uStack_1002 = auVar63[8];
        uStack_1001 = auVar63[9];
        local_1018 = (undefined1)uVar3;
        uStack_1017 = (undefined1)((ulong)uVar3 >> 8);
        uStack_1016 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_1015 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_1014 = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_1013 = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_1012 = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_1011 = (undefined1)((ulong)uVar3 >> 0x38);
        local_19d8._0_2_ = CONCAT11(local_1018,local_1008);
        local_19d8._0_3_ = CONCAT12(uStack_1007,(undefined2)local_19d8);
        local_19d8._0_4_ = CONCAT13(uStack_1017,(undefined3)local_19d8);
        local_19d8._0_5_ = CONCAT14(uStack_1006,(undefined4)local_19d8);
        local_19d8._0_6_ = CONCAT15(uStack_1016,(undefined5)local_19d8);
        local_19d8._0_7_ = CONCAT16(uStack_1005,(undefined6)local_19d8);
        local_19d8 = CONCAT17(uStack_1015,(undefined7)local_19d8);
        uStack_19d0._0_1_ = uStack_1004;
        uStack_19d0._1_1_ = uStack_1014;
        uStack_19d0._2_1_ = uStack_1003;
        uStack_19d0._3_1_ = uStack_1013;
        uStack_19d0._4_1_ = uStack_1002;
        uStack_19d0._5_1_ = uStack_1012;
        uStack_19d0._6_1_ = uStack_1001;
        uStack_19d0._7_1_ = uStack_1011;
        local_1028 = auVar64[2];
        uStack_1027 = auVar64[3];
        uStack_1026 = auVar64[4];
        uStack_1025 = auVar64[5];
        uStack_1024 = auVar64[6];
        uStack_1023 = auVar64[7];
        uStack_1022 = auVar64[8];
        uStack_1021 = auVar64[9];
        local_1038 = (undefined1)uVar4;
        uStack_1037 = (undefined1)((ulong)uVar4 >> 8);
        uStack_1036 = (undefined1)((ulong)uVar4 >> 0x10);
        uStack_1035 = (undefined1)((ulong)uVar4 >> 0x18);
        uStack_1034 = (undefined1)((ulong)uVar4 >> 0x20);
        uStack_1033 = (undefined1)((ulong)uVar4 >> 0x28);
        uStack_1032 = (undefined1)((ulong)uVar4 >> 0x30);
        uStack_1031 = (undefined1)((ulong)uVar4 >> 0x38);
        local_19e8._0_2_ = CONCAT11(local_1038,local_1028);
        local_19e8._0_3_ = CONCAT12(uStack_1027,(undefined2)local_19e8);
        local_19e8._0_4_ = CONCAT13(uStack_1037,(undefined3)local_19e8);
        local_19e8._0_5_ = CONCAT14(uStack_1026,(undefined4)local_19e8);
        local_19e8._0_6_ = CONCAT15(uStack_1036,(undefined5)local_19e8);
        local_19e8._0_7_ = CONCAT16(uStack_1025,(undefined6)local_19e8);
        local_19e8 = CONCAT17(uStack_1035,(undefined7)local_19e8);
        uStack_19e0._0_1_ = uStack_1024;
        uStack_19e0._1_1_ = uStack_1034;
        uStack_19e0._2_1_ = uStack_1023;
        uStack_19e0._3_1_ = uStack_1033;
        uStack_19e0._4_1_ = uStack_1022;
        uStack_19e0._5_1_ = uStack_1032;
        uStack_19e0._6_1_ = uStack_1021;
        uStack_19e0._7_1_ = uStack_1031;
        pVar74 = (unkbyte10 *)
                 (in_RDI + (short)(sVar73 + sStack_11e0 * -2) + (long)local_1660 * -2 + -8);
        uVar1 = *(undefined8 *)pVar74;
        Var61 = *pVar74;
        pVar74 = (unkbyte10 *)
                 (in_RDI + (short)(sVar73 + sStack_11de * -2) + (long)local_1660 * -2 + -8);
        uVar2 = *(undefined8 *)pVar74;
        Var62 = *pVar74;
        pauVar75 = (undefined1 (*) [12])
                   (in_RDI + (short)(sVar73 + sStack_11dc * -2) + (long)local_1660 * -2 + -8);
        uVar3 = *(undefined8 *)*pauVar75;
        auVar63 = *pauVar75;
        pauVar75 = (undefined1 (*) [12])
                   (in_RDI + (short)(sVar73 + sStack_11da * -2) + (long)local_1660 * -2 + -8);
        uVar4 = *(undefined8 *)*pauVar75;
        auVar64 = *pauVar75;
        local_1048 = (undefined1)((unkuint10)Var61 >> 0x10);
        uStack_1047 = (undefined1)((unkuint10)Var61 >> 0x18);
        uStack_1046 = (undefined1)((unkuint10)Var61 >> 0x20);
        uStack_1045 = (undefined1)((unkuint10)Var61 >> 0x28);
        uStack_1044 = (undefined1)((unkuint10)Var61 >> 0x30);
        uStack_1043 = (undefined1)((unkuint10)Var61 >> 0x38);
        uStack_1042 = (undefined1)((unkuint10)Var61 >> 0x40);
        uStack_1041 = (undefined1)((unkuint10)Var61 >> 0x48);
        local_1058 = (undefined1)uVar1;
        uStack_1057 = (undefined1)((ulong)uVar1 >> 8);
        uStack_1056 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_1055 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_1054 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_1053 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_1052 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_1051 = (undefined1)((ulong)uVar1 >> 0x38);
        local_1a38._0_2_ = CONCAT11(local_1058,local_1048);
        local_1a38._0_3_ = CONCAT12(uStack_1047,(undefined2)local_1a38);
        local_1a38._0_4_ = CONCAT13(uStack_1057,(undefined3)local_1a38);
        local_1a38._0_5_ = CONCAT14(uStack_1046,(undefined4)local_1a38);
        local_1a38._0_6_ = CONCAT15(uStack_1056,(undefined5)local_1a38);
        local_1a38._0_7_ = CONCAT16(uStack_1045,(undefined6)local_1a38);
        local_1a38 = CONCAT17(uStack_1055,(undefined7)local_1a38);
        uStack_1a30._0_1_ = uStack_1044;
        uStack_1a30._1_1_ = uStack_1054;
        uStack_1a30._2_1_ = uStack_1043;
        uStack_1a30._3_1_ = uStack_1053;
        uStack_1a30._4_1_ = uStack_1042;
        uStack_1a30._5_1_ = uStack_1052;
        uStack_1a30._6_1_ = uStack_1041;
        uStack_1a30._7_1_ = uStack_1051;
        local_1068 = (undefined1)((unkuint10)Var62 >> 0x10);
        uStack_1067 = (undefined1)((unkuint10)Var62 >> 0x18);
        uStack_1066 = (undefined1)((unkuint10)Var62 >> 0x20);
        uStack_1065 = (undefined1)((unkuint10)Var62 >> 0x28);
        uStack_1064 = (undefined1)((unkuint10)Var62 >> 0x30);
        uStack_1063 = (undefined1)((unkuint10)Var62 >> 0x38);
        uStack_1062 = (undefined1)((unkuint10)Var62 >> 0x40);
        uStack_1061 = (undefined1)((unkuint10)Var62 >> 0x48);
        local_1078 = (undefined1)uVar2;
        uStack_1077 = (undefined1)((ulong)uVar2 >> 8);
        uStack_1076 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_1075 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_1074 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_1073 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_1072 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_1071 = (undefined1)((ulong)uVar2 >> 0x38);
        local_1a48._0_2_ = CONCAT11(local_1078,local_1068);
        local_1a48._0_3_ = CONCAT12(uStack_1067,(undefined2)local_1a48);
        local_1a48._0_4_ = CONCAT13(uStack_1077,(undefined3)local_1a48);
        local_1a48._0_5_ = CONCAT14(uStack_1066,(undefined4)local_1a48);
        local_1a48._0_6_ = CONCAT15(uStack_1076,(undefined5)local_1a48);
        local_1a48._0_7_ = CONCAT16(uStack_1065,(undefined6)local_1a48);
        local_1a48 = CONCAT17(uStack_1075,(undefined7)local_1a48);
        uStack_1a40._0_1_ = uStack_1064;
        uStack_1a40._1_1_ = uStack_1074;
        uStack_1a40._2_1_ = uStack_1063;
        uStack_1a40._3_1_ = uStack_1073;
        uStack_1a40._4_1_ = uStack_1062;
        uStack_1a40._5_1_ = uStack_1072;
        uStack_1a40._6_1_ = uStack_1061;
        uStack_1a40._7_1_ = uStack_1071;
        local_1088 = auVar63[2];
        uStack_1087 = auVar63[3];
        uStack_1086 = auVar63[4];
        uStack_1085 = auVar63[5];
        uStack_1084 = auVar63[6];
        uStack_1083 = auVar63[7];
        uStack_1082 = auVar63[8];
        uStack_1081 = auVar63[9];
        local_1098 = (undefined1)uVar3;
        uStack_1097 = (undefined1)((ulong)uVar3 >> 8);
        uStack_1096 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_1095 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_1094 = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_1093 = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_1092 = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_1091 = (undefined1)((ulong)uVar3 >> 0x38);
        local_1a58._0_2_ = CONCAT11(local_1098,local_1088);
        local_1a58._0_3_ = CONCAT12(uStack_1087,(undefined2)local_1a58);
        local_1a58._0_4_ = CONCAT13(uStack_1097,(undefined3)local_1a58);
        local_1a58._0_5_ = CONCAT14(uStack_1086,(undefined4)local_1a58);
        local_1a58._0_6_ = CONCAT15(uStack_1096,(undefined5)local_1a58);
        local_1a58._0_7_ = CONCAT16(uStack_1085,(undefined6)local_1a58);
        local_1a58 = CONCAT17(uStack_1095,(undefined7)local_1a58);
        uStack_1a50._0_1_ = uStack_1084;
        uStack_1a50._1_1_ = uStack_1094;
        uStack_1a50._2_1_ = uStack_1083;
        uStack_1a50._3_1_ = uStack_1093;
        uStack_1a50._4_1_ = uStack_1082;
        uStack_1a50._5_1_ = uStack_1092;
        uStack_1a50._6_1_ = uStack_1081;
        uStack_1a50._7_1_ = uStack_1091;
        local_10a8 = auVar64[2];
        uStack_10a7 = auVar64[3];
        uStack_10a6 = auVar64[4];
        uStack_10a5 = auVar64[5];
        uStack_10a4 = auVar64[6];
        uStack_10a3 = auVar64[7];
        uStack_10a2 = auVar64[8];
        uStack_10a1 = auVar64[9];
        local_10b8 = (undefined1)uVar4;
        uStack_10b7 = (undefined1)((ulong)uVar4 >> 8);
        uStack_10b6 = (undefined1)((ulong)uVar4 >> 0x10);
        uStack_10b5 = (undefined1)((ulong)uVar4 >> 0x18);
        uStack_10b4 = (undefined1)((ulong)uVar4 >> 0x20);
        uStack_10b3 = (undefined1)((ulong)uVar4 >> 0x28);
        uStack_10b2 = (undefined1)((ulong)uVar4 >> 0x30);
        uStack_10b1 = (undefined1)((ulong)uVar4 >> 0x38);
        local_1a68._0_2_ = CONCAT11(local_10b8,local_10a8);
        local_1a68._0_3_ = CONCAT12(uStack_10a7,(undefined2)local_1a68);
        local_1a68._0_4_ = CONCAT13(uStack_10b7,(undefined3)local_1a68);
        local_1a68._0_5_ = CONCAT14(uStack_10a6,(undefined4)local_1a68);
        local_1a68._0_6_ = CONCAT15(uStack_10b6,(undefined5)local_1a68);
        local_1a68._0_7_ = CONCAT16(uStack_10a5,(undefined6)local_1a68);
        local_1a68 = CONCAT17(uStack_10b5,(undefined7)local_1a68);
        uStack_1a60._0_1_ = uStack_10a4;
        uStack_1a60._1_1_ = uStack_10b4;
        uStack_1a60._2_1_ = uStack_10a3;
        uStack_1a60._3_1_ = uStack_10b3;
        uStack_1a60._4_1_ = uStack_10a2;
        uStack_1a60._5_1_ = uStack_10b2;
        uStack_1a60._6_1_ = uStack_10a1;
        uStack_1a60._7_1_ = uStack_10b1;
        auVar52._8_8_ = uStack_19b0;
        auVar52._0_8_ = local_19b8;
        auVar51._8_8_ = uStack_1930;
        auVar78 = pmaddubsw(auVar52,auVar51);
        auVar50._8_8_ = uStack_19c0;
        auVar50._0_8_ = local_19c8;
        auVar49._8_8_ = uStack_1940;
        auVar82 = pmaddubsw(auVar50,auVar49);
        auVar48._8_8_ = uStack_19d0;
        auVar48._0_8_ = local_19d8;
        auVar47._8_8_ = uStack_1950;
        auVar83 = pmaddubsw(auVar48,auVar47);
        auVar46._8_8_ = uStack_19e0;
        auVar46._0_8_ = local_19e8;
        auVar45._8_8_ = uStack_1960;
        auVar84 = pmaddubsw(auVar46,auVar45);
        auVar44._8_8_ = uStack_1a30;
        auVar44._0_8_ = local_1a38;
        auVar43._8_8_ = uStack_1970;
        auVar85 = pmaddubsw(auVar44,auVar43);
        auVar42._8_8_ = uStack_1a40;
        auVar42._0_8_ = local_1a48;
        auVar81._8_8_ = uStack_1980;
        auVar86 = pmaddubsw(auVar42,auVar81);
        auVar41._8_8_ = uStack_1a50;
        auVar41._0_8_ = local_1a58;
        auVar80._8_8_ = uStack_1990;
        auVar87 = pmaddubsw(auVar41,auVar80);
        auVar40._8_8_ = uStack_1a60;
        auVar40._0_8_ = local_1a68;
        auVar79._8_8_ = uStack_19a0;
        auVar88 = pmaddubsw(auVar40,auVar79);
        local_1228 = auVar78._0_2_;
        sStack_1226 = auVar78._2_2_;
        sStack_1224 = auVar78._4_2_;
        sStack_1222 = auVar78._6_2_;
        sStack_1220 = auVar78._8_2_;
        sStack_121e = auVar78._10_2_;
        sStack_121c = auVar78._12_2_;
        sStack_121a = auVar78._14_2_;
        local_19b8._0_4_ = CONCAT22(sStack_1226 + 0x10,local_1228 + 0x10);
        local_19b8._0_6_ = CONCAT24(sStack_1224 + 0x10,(undefined4)local_19b8);
        local_19b8 = CONCAT26(sStack_1222 + 0x10,(undefined6)local_19b8);
        uStack_19b0._0_2_ = sStack_1220 + 0x10;
        uStack_19b0._2_2_ = sStack_121e + 0x10;
        uStack_19b0._4_2_ = sStack_121c + 0x10;
        uStack_19b0._6_2_ = sStack_121a + 0x10;
        local_1248 = auVar82._0_2_;
        sStack_1246 = auVar82._2_2_;
        sStack_1244 = auVar82._4_2_;
        sStack_1242 = auVar82._6_2_;
        sStack_1240 = auVar82._8_2_;
        sStack_123e = auVar82._10_2_;
        sStack_123c = auVar82._12_2_;
        sStack_123a = auVar82._14_2_;
        local_19c8._0_4_ = CONCAT22(sStack_1246 + 0x10,local_1248 + 0x10);
        local_19c8._0_6_ = CONCAT24(sStack_1244 + 0x10,(undefined4)local_19c8);
        local_19c8 = CONCAT26(sStack_1242 + 0x10,(undefined6)local_19c8);
        uStack_19c0._0_2_ = sStack_1240 + 0x10;
        uStack_19c0._2_2_ = sStack_123e + 0x10;
        uStack_19c0._4_2_ = sStack_123c + 0x10;
        uStack_19c0._6_2_ = sStack_123a + 0x10;
        local_1268 = auVar83._0_2_;
        sStack_1266 = auVar83._2_2_;
        sStack_1264 = auVar83._4_2_;
        sStack_1262 = auVar83._6_2_;
        sStack_1260 = auVar83._8_2_;
        sStack_125e = auVar83._10_2_;
        sStack_125c = auVar83._12_2_;
        sStack_125a = auVar83._14_2_;
        local_19d8._0_4_ = CONCAT22(sStack_1266 + 0x10,local_1268 + 0x10);
        local_19d8._0_6_ = CONCAT24(sStack_1264 + 0x10,(undefined4)local_19d8);
        local_19d8 = CONCAT26(sStack_1262 + 0x10,(undefined6)local_19d8);
        uStack_19d0._0_2_ = sStack_1260 + 0x10;
        uStack_19d0._2_2_ = sStack_125e + 0x10;
        uStack_19d0._4_2_ = sStack_125c + 0x10;
        uStack_19d0._6_2_ = sStack_125a + 0x10;
        local_1288 = auVar84._0_2_;
        sStack_1286 = auVar84._2_2_;
        sStack_1284 = auVar84._4_2_;
        sStack_1282 = auVar84._6_2_;
        sStack_1280 = auVar84._8_2_;
        sStack_127e = auVar84._10_2_;
        sStack_127c = auVar84._12_2_;
        sStack_127a = auVar84._14_2_;
        local_19e8._0_4_ = CONCAT22(sStack_1286 + 0x10,local_1288 + 0x10);
        local_19e8._0_6_ = CONCAT24(sStack_1284 + 0x10,(undefined4)local_19e8);
        local_19e8 = CONCAT26(sStack_1282 + 0x10,(undefined6)local_19e8);
        uStack_19e0._0_2_ = sStack_1280 + 0x10;
        uStack_19e0._2_2_ = sStack_127e + 0x10;
        uStack_19e0._4_2_ = sStack_127c + 0x10;
        uStack_19e0._6_2_ = sStack_127a + 0x10;
        auVar34._8_8_ = uStack_19b0;
        auVar34._0_8_ = local_19b8;
        auVar78 = psraw(auVar34,ZEXT416(5));
        auVar33._8_8_ = uStack_19c0;
        auVar33._0_8_ = local_19c8;
        auVar82 = psraw(auVar33,ZEXT416(5));
        auVar32._8_8_ = uStack_19d0;
        auVar32._0_8_ = local_19d8;
        auVar83 = psraw(auVar32,ZEXT416(5));
        auVar31._8_8_ = uStack_19e0;
        auVar31._0_8_ = local_19e8;
        auVar84 = psraw(auVar31,ZEXT416(5));
        local_12a8 = auVar85._0_2_;
        sStack_12a6 = auVar85._2_2_;
        sStack_12a4 = auVar85._4_2_;
        sStack_12a2 = auVar85._6_2_;
        sStack_12a0 = auVar85._8_2_;
        sStack_129e = auVar85._10_2_;
        sStack_129c = auVar85._12_2_;
        sStack_129a = auVar85._14_2_;
        local_1a38._0_4_ = CONCAT22(sStack_12a6 + 0x10,local_12a8 + 0x10);
        local_1a38._0_6_ = CONCAT24(sStack_12a4 + 0x10,(undefined4)local_1a38);
        local_1a38 = CONCAT26(sStack_12a2 + 0x10,(undefined6)local_1a38);
        uStack_1a30._0_2_ = sStack_12a0 + 0x10;
        uStack_1a30._2_2_ = sStack_129e + 0x10;
        uStack_1a30._4_2_ = sStack_129c + 0x10;
        uStack_1a30._6_2_ = sStack_129a + 0x10;
        local_12c8 = auVar86._0_2_;
        sStack_12c6 = auVar86._2_2_;
        sStack_12c4 = auVar86._4_2_;
        sStack_12c2 = auVar86._6_2_;
        sStack_12c0 = auVar86._8_2_;
        sStack_12be = auVar86._10_2_;
        sStack_12bc = auVar86._12_2_;
        sStack_12ba = auVar86._14_2_;
        local_1a48._0_4_ = CONCAT22(sStack_12c6 + 0x10,local_12c8 + 0x10);
        local_1a48._0_6_ = CONCAT24(sStack_12c4 + 0x10,(undefined4)local_1a48);
        local_1a48 = CONCAT26(sStack_12c2 + 0x10,(undefined6)local_1a48);
        uStack_1a40._0_2_ = sStack_12c0 + 0x10;
        uStack_1a40._2_2_ = sStack_12be + 0x10;
        uStack_1a40._4_2_ = sStack_12bc + 0x10;
        uStack_1a40._6_2_ = sStack_12ba + 0x10;
        local_12e8 = auVar87._0_2_;
        sStack_12e6 = auVar87._2_2_;
        sStack_12e4 = auVar87._4_2_;
        sStack_12e2 = auVar87._6_2_;
        sStack_12e0 = auVar87._8_2_;
        sStack_12de = auVar87._10_2_;
        sStack_12dc = auVar87._12_2_;
        sStack_12da = auVar87._14_2_;
        local_1a58._0_4_ = CONCAT22(sStack_12e6 + 0x10,local_12e8 + 0x10);
        local_1a58._0_6_ = CONCAT24(sStack_12e4 + 0x10,(undefined4)local_1a58);
        local_1a58 = CONCAT26(sStack_12e2 + 0x10,(undefined6)local_1a58);
        uStack_1a50._0_2_ = sStack_12e0 + 0x10;
        uStack_1a50._2_2_ = sStack_12de + 0x10;
        uStack_1a50._4_2_ = sStack_12dc + 0x10;
        uStack_1a50._6_2_ = sStack_12da + 0x10;
        local_1308 = auVar88._0_2_;
        sStack_1306 = auVar88._2_2_;
        sStack_1304 = auVar88._4_2_;
        sStack_1302 = auVar88._6_2_;
        sStack_1300 = auVar88._8_2_;
        sStack_12fe = auVar88._10_2_;
        sStack_12fc = auVar88._12_2_;
        sStack_12fa = auVar88._14_2_;
        local_1a68._0_4_ = CONCAT22(sStack_1306 + 0x10,local_1308 + 0x10);
        local_1a68._0_6_ = CONCAT24(sStack_1304 + 0x10,(undefined4)local_1a68);
        local_1a68 = CONCAT26(sStack_1302 + 0x10,(undefined6)local_1a68);
        uStack_1a60._0_2_ = sStack_1300 + 0x10;
        uStack_1a60._2_2_ = sStack_12fe + 0x10;
        uStack_1a60._4_2_ = sStack_12fc + 0x10;
        uStack_1a60._6_2_ = sStack_12fa + 0x10;
        auVar30._8_8_ = uStack_1a30;
        auVar30._0_8_ = local_1a38;
        auVar85 = psraw(auVar30,ZEXT416(5));
        auVar29._8_8_ = uStack_1a40;
        auVar29._0_8_ = local_1a48;
        auVar86 = psraw(auVar29,ZEXT416(5));
        auVar28._8_8_ = uStack_1a50;
        auVar28._0_8_ = local_1a58;
        auVar87 = psraw(auVar28,ZEXT416(5));
        auVar27._8_8_ = uStack_1a60;
        auVar27._0_8_ = local_1a68;
        auVar88 = psraw(auVar27,ZEXT416(5));
        local_cc8 = auVar78._0_2_;
        sStack_cc6 = auVar78._2_2_;
        sStack_cc4 = auVar78._4_2_;
        sStack_cc2 = auVar78._6_2_;
        sStack_cc0 = auVar78._8_2_;
        sStack_cbe = auVar78._10_2_;
        sStack_cbc = auVar78._12_2_;
        sStack_cba = auVar78._14_2_;
        local_19b8._0_2_ =
             CONCAT11((0 < sStack_cc6) * (sStack_cc6 < 0x100) * auVar78[2] - (0xff < sStack_cc6),
                      (0 < local_cc8) * (local_cc8 < 0x100) * auVar78[0] - (0xff < local_cc8));
        local_19b8._0_3_ =
             CONCAT12((0 < sStack_cc4) * (sStack_cc4 < 0x100) * auVar78[4] - (0xff < sStack_cc4),
                      (undefined2)local_19b8);
        local_19b8._0_4_ =
             CONCAT13((0 < sStack_cc2) * (sStack_cc2 < 0x100) * auVar78[6] - (0xff < sStack_cc2),
                      (undefined3)local_19b8);
        local_19b8._0_5_ =
             CONCAT14((0 < sStack_cc0) * (sStack_cc0 < 0x100) * auVar78[8] - (0xff < sStack_cc0),
                      (undefined4)local_19b8);
        local_19b8._0_6_ =
             CONCAT15((0 < sStack_cbe) * (sStack_cbe < 0x100) * auVar78[10] - (0xff < sStack_cbe),
                      (undefined5)local_19b8);
        local_19b8._0_7_ =
             CONCAT16((0 < sStack_cbc) * (sStack_cbc < 0x100) * auVar78[0xc] - (0xff < sStack_cbc),
                      (undefined6)local_19b8);
        local_19b8 = CONCAT17((0 < sStack_cba) * (sStack_cba < 0x100) * auVar78[0xe] -
                              (0xff < sStack_cba),(undefined7)local_19b8);
        local_ce8 = auVar82._0_2_;
        sStack_ce6 = auVar82._2_2_;
        sStack_ce4 = auVar82._4_2_;
        sStack_ce2 = auVar82._6_2_;
        sStack_ce0 = auVar82._8_2_;
        sStack_cde = auVar82._10_2_;
        sStack_cdc = auVar82._12_2_;
        sStack_cda = auVar82._14_2_;
        local_19c8._0_2_ =
             CONCAT11((0 < sStack_ce6) * (sStack_ce6 < 0x100) * auVar82[2] - (0xff < sStack_ce6),
                      (0 < local_ce8) * (local_ce8 < 0x100) * auVar82[0] - (0xff < local_ce8));
        local_19c8._0_3_ =
             CONCAT12((0 < sStack_ce4) * (sStack_ce4 < 0x100) * auVar82[4] - (0xff < sStack_ce4),
                      (undefined2)local_19c8);
        local_19c8._0_4_ =
             CONCAT13((0 < sStack_ce2) * (sStack_ce2 < 0x100) * auVar82[6] - (0xff < sStack_ce2),
                      (undefined3)local_19c8);
        local_19c8._0_5_ =
             CONCAT14((0 < sStack_ce0) * (sStack_ce0 < 0x100) * auVar82[8] - (0xff < sStack_ce0),
                      (undefined4)local_19c8);
        local_19c8._0_6_ =
             CONCAT15((0 < sStack_cde) * (sStack_cde < 0x100) * auVar82[10] - (0xff < sStack_cde),
                      (undefined5)local_19c8);
        local_19c8._0_7_ =
             CONCAT16((0 < sStack_cdc) * (sStack_cdc < 0x100) * auVar82[0xc] - (0xff < sStack_cdc),
                      (undefined6)local_19c8);
        local_19c8 = CONCAT17((0 < sStack_cda) * (sStack_cda < 0x100) * auVar82[0xe] -
                              (0xff < sStack_cda),(undefined7)local_19c8);
        local_d08 = auVar83._0_2_;
        sStack_d06 = auVar83._2_2_;
        sStack_d04 = auVar83._4_2_;
        sStack_d02 = auVar83._6_2_;
        sStack_d00 = auVar83._8_2_;
        sStack_cfe = auVar83._10_2_;
        sStack_cfc = auVar83._12_2_;
        sStack_cfa = auVar83._14_2_;
        local_19d8._0_2_ =
             CONCAT11((0 < sStack_d06) * (sStack_d06 < 0x100) * auVar83[2] - (0xff < sStack_d06),
                      (0 < local_d08) * (local_d08 < 0x100) * auVar83[0] - (0xff < local_d08));
        local_19d8._0_3_ =
             CONCAT12((0 < sStack_d04) * (sStack_d04 < 0x100) * auVar83[4] - (0xff < sStack_d04),
                      (undefined2)local_19d8);
        local_19d8._0_4_ =
             CONCAT13((0 < sStack_d02) * (sStack_d02 < 0x100) * auVar83[6] - (0xff < sStack_d02),
                      (undefined3)local_19d8);
        local_19d8._0_5_ =
             CONCAT14((0 < sStack_d00) * (sStack_d00 < 0x100) * auVar83[8] - (0xff < sStack_d00),
                      (undefined4)local_19d8);
        local_19d8._0_6_ =
             CONCAT15((0 < sStack_cfe) * (sStack_cfe < 0x100) * auVar83[10] - (0xff < sStack_cfe),
                      (undefined5)local_19d8);
        local_19d8._0_7_ =
             CONCAT16((0 < sStack_cfc) * (sStack_cfc < 0x100) * auVar83[0xc] - (0xff < sStack_cfc),
                      (undefined6)local_19d8);
        local_19d8 = CONCAT17((0 < sStack_cfa) * (sStack_cfa < 0x100) * auVar83[0xe] -
                              (0xff < sStack_cfa),(undefined7)local_19d8);
        local_d28 = auVar84._0_2_;
        sStack_d26 = auVar84._2_2_;
        sStack_d24 = auVar84._4_2_;
        sStack_d22 = auVar84._6_2_;
        sStack_d20 = auVar84._8_2_;
        sStack_d1e = auVar84._10_2_;
        sStack_d1c = auVar84._12_2_;
        sStack_d1a = auVar84._14_2_;
        local_19e8._0_2_ =
             CONCAT11((0 < sStack_d26) * (sStack_d26 < 0x100) * auVar84[2] - (0xff < sStack_d26),
                      (0 < local_d28) * (local_d28 < 0x100) * auVar84[0] - (0xff < local_d28));
        local_19e8._0_3_ =
             CONCAT12((0 < sStack_d24) * (sStack_d24 < 0x100) * auVar84[4] - (0xff < sStack_d24),
                      (undefined2)local_19e8);
        local_19e8._0_4_ =
             CONCAT13((0 < sStack_d22) * (sStack_d22 < 0x100) * auVar84[6] - (0xff < sStack_d22),
                      (undefined3)local_19e8);
        local_19e8._0_5_ =
             CONCAT14((0 < sStack_d20) * (sStack_d20 < 0x100) * auVar84[8] - (0xff < sStack_d20),
                      (undefined4)local_19e8);
        local_19e8._0_6_ =
             CONCAT15((0 < sStack_d1e) * (sStack_d1e < 0x100) * auVar84[10] - (0xff < sStack_d1e),
                      (undefined5)local_19e8);
        local_19e8._0_7_ =
             CONCAT16((0 < sStack_d1c) * (sStack_d1c < 0x100) * auVar84[0xc] - (0xff < sStack_d1c),
                      (undefined6)local_19e8);
        local_19e8 = CONCAT17((0 < sStack_d1a) * (sStack_d1a < 0x100) * auVar84[0xe] -
                              (0xff < sStack_d1a),(undefined7)local_19e8);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_19b8;
        auVar17[8] = '\b';
        auVar17[9] = '\b';
        auVar17[10] = '\b';
        auVar17[0xb] = '\b';
        auVar17[0xc] = '\b';
        auVar17[0xd] = '\b';
        auVar17[0xe] = '\b';
        auVar17[0xf] = '\b';
        auVar17[0] = '\x06';
        auVar17[1] = '\a';
        auVar17[2] = '\x04';
        auVar17[3] = '\x05';
        auVar17[4] = '\x02';
        auVar17[5] = '\x03';
        auVar17[6] = '\0';
        auVar17[7] = '\x01';
        pshufb(auVar18,auVar17);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_19c8;
        auVar15[8] = '\b';
        auVar15[9] = '\b';
        auVar15[10] = '\b';
        auVar15[0xb] = '\b';
        auVar15[0xc] = '\b';
        auVar15[0xd] = '\b';
        auVar15[0xe] = '\b';
        auVar15[0xf] = '\b';
        auVar15[0] = '\x06';
        auVar15[1] = '\a';
        auVar15[2] = '\x04';
        auVar15[3] = '\x05';
        auVar15[4] = '\x02';
        auVar15[5] = '\x03';
        auVar15[6] = '\0';
        auVar15[7] = '\x01';
        pshufb(auVar16,auVar15);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_19d8;
        auVar13[8] = '\b';
        auVar13[9] = '\b';
        auVar13[10] = '\b';
        auVar13[0xb] = '\b';
        auVar13[0xc] = '\b';
        auVar13[0xd] = '\b';
        auVar13[0xe] = '\b';
        auVar13[0xf] = '\b';
        auVar13[0] = '\x06';
        auVar13[1] = '\a';
        auVar13[2] = '\x04';
        auVar13[3] = '\x05';
        auVar13[4] = '\x02';
        auVar13[5] = '\x03';
        auVar13[6] = '\0';
        auVar13[7] = '\x01';
        auVar78 = pshufb(auVar14,auVar13);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_19e8;
        auVar89[8] = '\b';
        auVar89[9] = '\b';
        auVar89[10] = '\b';
        auVar89[0xb] = '\b';
        auVar89[0xc] = '\b';
        auVar89[0xd] = '\b';
        auVar89[0xe] = '\b';
        auVar89[0xf] = '\b';
        auVar89[0] = '\x06';
        auVar89[1] = '\a';
        auVar89[2] = '\x04';
        auVar89[3] = '\x05';
        auVar89[4] = '\x02';
        auVar89[5] = '\x03';
        auVar89[6] = '\0';
        auVar89[7] = '\x01';
        auVar89 = pshufb(auVar12,auVar89);
        local_d48 = auVar85._0_2_;
        sStack_d46 = auVar85._2_2_;
        sStack_d44 = auVar85._4_2_;
        sStack_d42 = auVar85._6_2_;
        sStack_d40 = auVar85._8_2_;
        sStack_d3e = auVar85._10_2_;
        sStack_d3c = auVar85._12_2_;
        sStack_d3a = auVar85._14_2_;
        local_1a38._0_2_ =
             CONCAT11((0 < sStack_d46) * (sStack_d46 < 0x100) * auVar85[2] - (0xff < sStack_d46),
                      (0 < local_d48) * (local_d48 < 0x100) * auVar85[0] - (0xff < local_d48));
        local_1a38._0_3_ =
             CONCAT12((0 < sStack_d44) * (sStack_d44 < 0x100) * auVar85[4] - (0xff < sStack_d44),
                      (undefined2)local_1a38);
        local_1a38._0_4_ =
             CONCAT13((0 < sStack_d42) * (sStack_d42 < 0x100) * auVar85[6] - (0xff < sStack_d42),
                      (undefined3)local_1a38);
        local_1a38._0_5_ =
             CONCAT14((0 < sStack_d40) * (sStack_d40 < 0x100) * auVar85[8] - (0xff < sStack_d40),
                      (undefined4)local_1a38);
        local_1a38._0_6_ =
             CONCAT15((0 < sStack_d3e) * (sStack_d3e < 0x100) * auVar85[10] - (0xff < sStack_d3e),
                      (undefined5)local_1a38);
        local_1a38._0_7_ =
             CONCAT16((0 < sStack_d3c) * (sStack_d3c < 0x100) * auVar85[0xc] - (0xff < sStack_d3c),
                      (undefined6)local_1a38);
        local_1a38 = CONCAT17((0 < sStack_d3a) * (sStack_d3a < 0x100) * auVar85[0xe] -
                              (0xff < sStack_d3a),(undefined7)local_1a38);
        local_d68 = auVar86._0_2_;
        sStack_d66 = auVar86._2_2_;
        sStack_d64 = auVar86._4_2_;
        sStack_d62 = auVar86._6_2_;
        sStack_d60 = auVar86._8_2_;
        sStack_d5e = auVar86._10_2_;
        sStack_d5c = auVar86._12_2_;
        sStack_d5a = auVar86._14_2_;
        local_1a48._0_2_ =
             CONCAT11((0 < sStack_d66) * (sStack_d66 < 0x100) * auVar86[2] - (0xff < sStack_d66),
                      (0 < local_d68) * (local_d68 < 0x100) * auVar86[0] - (0xff < local_d68));
        local_1a48._0_3_ =
             CONCAT12((0 < sStack_d64) * (sStack_d64 < 0x100) * auVar86[4] - (0xff < sStack_d64),
                      (undefined2)local_1a48);
        local_1a48._0_4_ =
             CONCAT13((0 < sStack_d62) * (sStack_d62 < 0x100) * auVar86[6] - (0xff < sStack_d62),
                      (undefined3)local_1a48);
        local_1a48._0_5_ =
             CONCAT14((0 < sStack_d60) * (sStack_d60 < 0x100) * auVar86[8] - (0xff < sStack_d60),
                      (undefined4)local_1a48);
        local_1a48._0_6_ =
             CONCAT15((0 < sStack_d5e) * (sStack_d5e < 0x100) * auVar86[10] - (0xff < sStack_d5e),
                      (undefined5)local_1a48);
        local_1a48._0_7_ =
             CONCAT16((0 < sStack_d5c) * (sStack_d5c < 0x100) * auVar86[0xc] - (0xff < sStack_d5c),
                      (undefined6)local_1a48);
        local_1a48 = CONCAT17((0 < sStack_d5a) * (sStack_d5a < 0x100) * auVar86[0xe] -
                              (0xff < sStack_d5a),(undefined7)local_1a48);
        local_d88 = auVar87._0_2_;
        sStack_d86 = auVar87._2_2_;
        sStack_d84 = auVar87._4_2_;
        sStack_d82 = auVar87._6_2_;
        sStack_d80 = auVar87._8_2_;
        sStack_d7e = auVar87._10_2_;
        sStack_d7c = auVar87._12_2_;
        sStack_d7a = auVar87._14_2_;
        local_1a58._0_2_ =
             CONCAT11((0 < sStack_d86) * (sStack_d86 < 0x100) * auVar87[2] - (0xff < sStack_d86),
                      (0 < local_d88) * (local_d88 < 0x100) * auVar87[0] - (0xff < local_d88));
        local_1a58._0_3_ =
             CONCAT12((0 < sStack_d84) * (sStack_d84 < 0x100) * auVar87[4] - (0xff < sStack_d84),
                      (undefined2)local_1a58);
        local_1a58._0_4_ =
             CONCAT13((0 < sStack_d82) * (sStack_d82 < 0x100) * auVar87[6] - (0xff < sStack_d82),
                      (undefined3)local_1a58);
        local_1a58._0_5_ =
             CONCAT14((0 < sStack_d80) * (sStack_d80 < 0x100) * auVar87[8] - (0xff < sStack_d80),
                      (undefined4)local_1a58);
        local_1a58._0_6_ =
             CONCAT15((0 < sStack_d7e) * (sStack_d7e < 0x100) * auVar87[10] - (0xff < sStack_d7e),
                      (undefined5)local_1a58);
        local_1a58._0_7_ =
             CONCAT16((0 < sStack_d7c) * (sStack_d7c < 0x100) * auVar87[0xc] - (0xff < sStack_d7c),
                      (undefined6)local_1a58);
        local_1a58 = CONCAT17((0 < sStack_d7a) * (sStack_d7a < 0x100) * auVar87[0xe] -
                              (0xff < sStack_d7a),(undefined7)local_1a58);
        local_da8 = auVar88._0_2_;
        sStack_da6 = auVar88._2_2_;
        sStack_da4 = auVar88._4_2_;
        sStack_da2 = auVar88._6_2_;
        sStack_da0 = auVar88._8_2_;
        sStack_d9e = auVar88._10_2_;
        sStack_d9c = auVar88._12_2_;
        sStack_d9a = auVar88._14_2_;
        local_1a68._0_2_ =
             CONCAT11((0 < sStack_da6) * (sStack_da6 < 0x100) * auVar88[2] - (0xff < sStack_da6),
                      (0 < local_da8) * (local_da8 < 0x100) * auVar88[0] - (0xff < local_da8));
        local_1a68._0_3_ =
             CONCAT12((0 < sStack_da4) * (sStack_da4 < 0x100) * auVar88[4] - (0xff < sStack_da4),
                      (undefined2)local_1a68);
        local_1a68._0_4_ =
             CONCAT13((0 < sStack_da2) * (sStack_da2 < 0x100) * auVar88[6] - (0xff < sStack_da2),
                      (undefined3)local_1a68);
        local_1a68._0_5_ =
             CONCAT14((0 < sStack_da0) * (sStack_da0 < 0x100) * auVar88[8] - (0xff < sStack_da0),
                      (undefined4)local_1a68);
        local_1a68._0_6_ =
             CONCAT15((0 < sStack_d9e) * (sStack_d9e < 0x100) * auVar88[10] - (0xff < sStack_d9e),
                      (undefined5)local_1a68);
        local_1a68._0_7_ =
             CONCAT16((0 < sStack_d9c) * (sStack_d9c < 0x100) * auVar88[0xc] - (0xff < sStack_d9c),
                      (undefined6)local_1a68);
        local_1a68 = CONCAT17((0 < sStack_d9a) * (sStack_d9a < 0x100) * auVar88[0xe] -
                              (0xff < sStack_d9a),(undefined7)local_1a68);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_1a38;
        auVar88[8] = '\b';
        auVar88[9] = '\b';
        auVar88[10] = '\b';
        auVar88[0xb] = '\b';
        auVar88[0xc] = '\b';
        auVar88[0xd] = '\b';
        auVar88[0xe] = '\b';
        auVar88[0xf] = '\b';
        auVar88[0] = '\x06';
        auVar88[1] = '\a';
        auVar88[2] = '\x04';
        auVar88[3] = '\x05';
        auVar88[4] = '\x02';
        auVar88[5] = '\x03';
        auVar88[6] = '\0';
        auVar88[7] = '\x01';
        auVar88 = pshufb(auVar11,auVar88);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = local_1a48;
        auVar86[8] = '\b';
        auVar86[9] = '\b';
        auVar86[10] = '\b';
        auVar86[0xb] = '\b';
        auVar86[0xc] = '\b';
        auVar86[0xd] = '\b';
        auVar86[0xe] = '\b';
        auVar86[0xf] = '\b';
        auVar86[0] = '\x06';
        auVar86[1] = '\a';
        auVar86[2] = '\x04';
        auVar86[3] = '\x05';
        auVar86[4] = '\x02';
        auVar86[5] = '\x03';
        auVar86[6] = '\0';
        auVar86[7] = '\x01';
        auVar86 = pshufb(auVar87,auVar86);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = local_1a58;
        auVar84[8] = '\b';
        auVar84[9] = '\b';
        auVar84[10] = '\b';
        auVar84[0xb] = '\b';
        auVar84[0xc] = '\b';
        auVar84[0xd] = '\b';
        auVar84[0xe] = '\b';
        auVar84[0xf] = '\b';
        auVar84[0] = '\x06';
        auVar84[1] = '\a';
        auVar84[2] = '\x04';
        auVar84[3] = '\x05';
        auVar84[4] = '\x02';
        auVar84[5] = '\x03';
        auVar84[6] = '\0';
        auVar84[7] = '\x01';
        auVar84 = pshufb(auVar85,auVar84);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = local_1a68;
        auVar82[8] = '\b';
        auVar82[9] = '\b';
        auVar82[10] = '\b';
        auVar82[0xb] = '\b';
        auVar82[0xc] = '\b';
        auVar82[0xd] = '\b';
        auVar82[0xe] = '\b';
        auVar82[0xf] = '\b';
        auVar82[0] = '\x06';
        auVar82[1] = '\a';
        auVar82[2] = '\x04';
        auVar82[3] = '\x05';
        auVar82[4] = '\x02';
        auVar82[5] = '\x03';
        auVar82[6] = '\0';
        auVar82[7] = '\x01';
        auVar82 = pshufb(auVar83,auVar82);
        uStack_9a6 = auVar78._2_2_;
        uStack_9a2 = auVar78._6_2_;
        uStack_9b6 = auVar89._2_2_;
        uStack_9b2 = auVar89._6_2_;
        uStack_1a40._6_2_ = uStack_9b6;
        uStack_1a40._4_2_ = uStack_9a6;
        uStack_1a60._6_2_ = uStack_9b2;
        uStack_1a60._4_2_ = uStack_9a2;
        local_1a48 = auVar86._0_8_;
        local_9c8 = auVar88._0_2_;
        uStack_9c4 = auVar88._4_2_;
        local_9d8 = auVar86._0_2_;
        uStack_9d4 = auVar86._4_2_;
        local_1a68 = auVar82._0_8_;
        local_9e8 = auVar84._0_2_;
        uStack_9e6 = auVar84._2_2_;
        uStack_9e4 = auVar84._4_2_;
        uStack_9e2 = auVar84._6_2_;
        local_9f8 = auVar82._0_2_;
        uStack_9f6 = auVar82._2_2_;
        uStack_9f4 = auVar82._4_2_;
        uStack_9f2 = auVar82._6_2_;
        uStack_444 = (undefined4)
                     (CONCAT26(uStack_9f6,CONCAT24(uStack_9e6,CONCAT22(local_9f8,local_9e8))) >>
                     0x20);
        uStack_3dc = (undefined4)
                     (CONCAT26(uStack_9f2,CONCAT24(uStack_9e2,CONCAT22(uStack_9f4,uStack_9e4))) >>
                     0x20);
        uStack_1a40._0_4_ = uStack_310;
        local_1a38 = CONCAT44(uStack_444,uStack_320);
        uStack_1a60._0_4_ = uStack_330;
        local_1a58 = CONCAT44(uStack_3dc,uStack_340);
        puVar76 = (undefined8 *)((long)in_RDX + (long)(in_ECX * local_1660) + (long)local_1664);
        *puVar76 = local_1a38;
        puVar76[1] = CONCAT44(CONCAT22(local_9f8,local_9e8),CONCAT22(local_9d8,local_9c8));
        puVar76 = (undefined8 *)
                  ((long)in_RDX + (long)(in_ECX * (local_1660 + 1)) + (long)local_1664);
        *puVar76 = local_1a48;
        puVar76[1] = uStack_1a40;
        puVar76 = (undefined8 *)
                  ((long)in_RDX + (long)(in_ECX * (local_1660 + 2)) + (long)local_1664);
        *puVar76 = local_1a58;
        puVar76[1] = CONCAT44(CONCAT22(uStack_9f4,uStack_9e4),CONCAT22(uStack_9d4,uStack_9c4));
        puVar76 = (undefined8 *)
                  ((long)in_RDX + (long)(in_ECX * (local_1660 + 3)) + (long)local_1664);
        *puVar76 = local_1a68;
        puVar76[1] = uStack_1a60;
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_3_to_9_ssse3(UWORD8 *pu1_ref,
                                               WORD32 src_strd,
                                               UWORD8 *pu1_dst,
                                               WORD32 dst_strd,
                                               WORD32 nt,
                                               WORD32 mode)
{
    WORD32 row, col;

    WORD32 intra_pred_ang;

    __m128i const_temp_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i fract_4x32b, zero_8x16b, intra_pred_ang_4x32b;
    __m128i row_4x32b, two_nt_4x32b, ref_main_idx_4x32b, res_temp5_4x32b, sm1;
    UNUSED(src_strd);

    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    sm1 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASKY7[0]);
    const_temp_4x32b  = _mm_set1_epi16(16);
    const_temp2_4x32b = _mm_set1_epi32(31);
    const_temp3_4x32b = _mm_set1_epi16(32);
    const_temp4_4x32b = _mm_set1_epi32(4);

    two_nt_4x32b = _mm_set1_epi32(1);

    zero_8x16b = _mm_set1_epi16(0);


    /* intra_pred_ang = gai4_ihevc_ang_table[mode]; */
    intra_pred_ang_4x32b = _mm_set1_epi32(intra_pred_ang);

    row_4x32b = _mm_set_epi32(4, 3, 2, 1);

    if(nt == 4)
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(4);
        two_nt_4x32b = _mm_set1_epi16((4 * nt) - 2);

        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD8  ai1_fract_temp_val[16], ai1_src_temp_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract4_8x16b;
            __m128i src_values10;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* fract = pos & (31); */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            ref_main_idx_4x32b = _mm_srai_epi16(res_temp5_4x32b,  5);

            ref_main_idx_4x32b = _mm_add_epi16(ref_main_idx_4x32b,  ref_main_idx_4x32b);

            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, ref_main_idx_4x32b);

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            /*(32 - fract) */
            src_values10 = _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            _mm_storel_epi64((__m128i *)(ai1_fract_temp_val), fract_4x32b);
            _mm_storel_epi64((__m128i *)(ai1_src_temp_val),  src_values10);

            fract1_8x16b = _mm_set1_epi8(ai1_fract_temp_val[0]);  /* col=0*/
            fract2_8x16b = _mm_set1_epi8(ai1_fract_temp_val[2]);  /* col=1*/
            fract3_8x16b = _mm_set1_epi8(ai1_fract_temp_val[4]);  /* col=2*/
            fract4_8x16b = _mm_set1_epi8(ai1_fract_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_set1_epi8(ai1_src_temp_val[0]);  /* col=0*/
            temp2_8x16b = _mm_set1_epi8(ai1_src_temp_val[2]);  /* col=1*/
            temp3_8x16b = _mm_set1_epi8(ai1_src_temp_val[4]);  /* col=2*/
            temp4_8x16b = _mm_set1_epi8(ai1_src_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_unpacklo_epi8(temp1_8x16b, fract1_8x16b);
            temp2_8x16b = _mm_unpacklo_epi8(temp2_8x16b, fract2_8x16b);
            temp3_8x16b = _mm_unpacklo_epi8(temp3_8x16b, fract3_8x16b);
            temp4_8x16b = _mm_unpacklo_epi8(temp4_8x16b, fract4_8x16b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 8)); /* col=0*/
                src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 8)); /* col=1*/
                src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 8)); /* col=2*/
                src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 8)); /* col=3*/

                src_temp1_8x16b = _mm_srli_si128(src_temp5_8x16b, 2); /* col=0*/
                src_temp2_8x16b = _mm_srli_si128(src_temp6_8x16b, 2); /* col=1*/
                src_temp3_8x16b = _mm_srli_si128(src_temp7_8x16b, 2); /* col=2*/
                src_temp4_8x16b = _mm_srli_si128(src_temp8_8x16b, 2); /* col=3*/

                src_temp1_8x16b =  _mm_unpacklo_epi8(src_temp1_8x16b, src_temp5_8x16b); /* col=0*/
                src_temp2_8x16b =  _mm_unpacklo_epi8(src_temp2_8x16b, src_temp6_8x16b); /* col=1*/
                src_temp3_8x16b =  _mm_unpacklo_epi8(src_temp3_8x16b, src_temp7_8x16b); /* col=2*/
                src_temp4_8x16b =  _mm_unpacklo_epi8(src_temp4_8x16b, src_temp8_8x16b); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, zero_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, zero_8x16b); /* col=1*/
                src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, zero_8x16b); /* col=2*/
                src_temp4_8x16b = _mm_packus_epi16(src_temp4_8x16b, zero_8x16b); /* col=3*/

                src_temp1_8x16b = _mm_shuffle_epi8(src_temp1_8x16b, sm1);
                src_temp2_8x16b = _mm_shuffle_epi8(src_temp2_8x16b, sm1);
                src_temp3_8x16b = _mm_shuffle_epi8(src_temp3_8x16b, sm1);
                src_temp4_8x16b = _mm_shuffle_epi8(src_temp4_8x16b, sm1);

                src_temp5_8x16b = _mm_unpacklo_epi16(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpacklo_epi16(src_temp3_8x16b, src_temp4_8x16b);

                src_temp8_8x16b = _mm_unpacklo_epi32(src_temp5_8x16b, src_temp6_8x16b);
                src_temp7_8x16b = _mm_unpackhi_epi32(src_temp5_8x16b, src_temp6_8x16b);

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 0)), src_temp8_8x16b);             /* row=0*/

                src_temp2_8x16b  = _mm_shuffle_epi32(src_temp8_8x16b, _MM_SHUFFLE(3, 2, 3, 2));
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (1))), src_temp2_8x16b);       /* row=1*/

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (2))), src_temp7_8x16b);       /* row=2*/

                src_temp4_8x16b  = _mm_shuffle_epi32(src_temp7_8x16b, _MM_SHUFFLE(3, 2, 3, 2));
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (3))), src_temp4_8x16b);       /* row=4*/

            }
        }
    }
    else
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        two_nt_4x32b = _mm_set1_epi16((4 * nt) - 2);

        for(col = 0; col < 2 * nt; col += 16)
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;
            WORD8  ai1_fract_temp_val[16], ai1_src_temp_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract4_8x16b;
            __m128i fract5_8x16b, fract6_8x16b, fract7_8x16b, fract8_8x16b, src_values10;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* fract = pos & (31); */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            ref_main_idx_4x32b = _mm_srai_epi16(res_temp5_4x32b,  5);

            ref_main_idx_4x32b = _mm_add_epi16(ref_main_idx_4x32b,  ref_main_idx_4x32b);

            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, ref_main_idx_4x32b);

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            /*(32 - fract) */
            src_values10 = _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            _mm_storeu_si128((__m128i *)(ai1_fract_temp_val), fract_4x32b);
            _mm_storeu_si128((__m128i *)(ai1_src_temp_val),  src_values10);

            fract1_8x16b = _mm_set1_epi8(ai1_fract_temp_val[0]);  /* col=0*/
            fract2_8x16b = _mm_set1_epi8(ai1_fract_temp_val[2]);  /* col=1*/
            fract3_8x16b = _mm_set1_epi8(ai1_fract_temp_val[4]);  /* col=2*/
            fract4_8x16b = _mm_set1_epi8(ai1_fract_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_set1_epi8(ai1_src_temp_val[0]);  /* col=0*/
            temp2_8x16b = _mm_set1_epi8(ai1_src_temp_val[2]);  /* col=1*/
            temp3_8x16b = _mm_set1_epi8(ai1_src_temp_val[4]);  /* col=2*/
            temp4_8x16b = _mm_set1_epi8(ai1_src_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_unpacklo_epi8(temp1_8x16b, fract1_8x16b);
            temp2_8x16b = _mm_unpacklo_epi8(temp2_8x16b, fract2_8x16b);
            temp3_8x16b = _mm_unpacklo_epi8(temp3_8x16b, fract3_8x16b);
            temp4_8x16b = _mm_unpacklo_epi8(temp4_8x16b, fract4_8x16b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            fract5_8x16b = _mm_set1_epi8(ai1_fract_temp_val[8]);  /* col=5*/
            fract6_8x16b = _mm_set1_epi8(ai1_fract_temp_val[10]);  /* col=6*/
            fract7_8x16b = _mm_set1_epi8(ai1_fract_temp_val[12]);  /* col=7*/
            fract8_8x16b = _mm_set1_epi8(ai1_fract_temp_val[14]);  /* col=8*/

            temp11_8x16b = _mm_set1_epi8(ai1_src_temp_val[8]);  /* col=0*/
            temp12_8x16b = _mm_set1_epi8(ai1_src_temp_val[10]);  /* col=1*/
            temp13_8x16b = _mm_set1_epi8(ai1_src_temp_val[12]);  /* col=2*/
            temp14_8x16b = _mm_set1_epi8(ai1_src_temp_val[14]);  /* col=3*/

            temp11_8x16b = _mm_unpacklo_epi8(temp11_8x16b, fract5_8x16b);
            temp12_8x16b = _mm_unpacklo_epi8(temp12_8x16b, fract6_8x16b);
            temp13_8x16b = _mm_unpacklo_epi8(temp13_8x16b, fract7_8x16b);
            temp14_8x16b = _mm_unpacklo_epi8(temp14_8x16b, fract8_8x16b);

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            for(row = 0; row < nt; row += 4)
            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - row - (8 + row))); /* col=0*/
                src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - row - (8 + row))); /* col=1*/
                src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - row - (8 + row))); /* col=2*/
                src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - row - (8 + row))); /* col=3*/

                src_temp1_8x16b = _mm_srli_si128(src_temp5_8x16b, 2); /* col=0*/
                src_temp2_8x16b = _mm_srli_si128(src_temp6_8x16b, 2); /* col=1*/
                src_temp3_8x16b = _mm_srli_si128(src_temp7_8x16b, 2); /* col=2*/
                src_temp4_8x16b = _mm_srli_si128(src_temp8_8x16b, 2); /* col=3*/

                src_temp1_8x16b =  _mm_unpacklo_epi8(src_temp1_8x16b, src_temp5_8x16b); /* col=0*/
                src_temp2_8x16b =  _mm_unpacklo_epi8(src_temp2_8x16b, src_temp6_8x16b); /* col=1*/
                src_temp3_8x16b =  _mm_unpacklo_epi8(src_temp3_8x16b, src_temp7_8x16b); /* col=2*/
                src_temp4_8x16b =  _mm_unpacklo_epi8(src_temp4_8x16b, src_temp8_8x16b); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp15_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - row - row - 8)); /* col=5*/
                src_temp16_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - row - row - 8)); /* col=6*/
                src_temp17_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - row - row - 8)); /* col=7*/
                src_temp18_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - row - row - 8)); /* col=8*/

                src_temp11_8x16b = _mm_srli_si128(src_temp15_8x16b, 2); /* col=5*/
                src_temp12_8x16b = _mm_srli_si128(src_temp16_8x16b, 2); /* col=6*/
                src_temp13_8x16b = _mm_srli_si128(src_temp17_8x16b, 2); /* col=7*/
                src_temp14_8x16b = _mm_srli_si128(src_temp18_8x16b, 2); /* col=8*/

                src_temp11_8x16b =  _mm_unpacklo_epi8(src_temp11_8x16b, src_temp15_8x16b); /* col=0*/
                src_temp12_8x16b =  _mm_unpacklo_epi8(src_temp12_8x16b, src_temp16_8x16b); /* col=1*/
                src_temp13_8x16b =  _mm_unpacklo_epi8(src_temp13_8x16b, src_temp17_8x16b); /* col=2*/
                src_temp14_8x16b =  _mm_unpacklo_epi8(src_temp14_8x16b, src_temp18_8x16b); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, zero_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, zero_8x16b); /* col=1*/
                src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, zero_8x16b); /* col=2*/
                src_temp4_8x16b = _mm_packus_epi16(src_temp4_8x16b, zero_8x16b); /* col=3*/

                src_temp1_8x16b = _mm_shuffle_epi8(src_temp1_8x16b, sm1);
                src_temp2_8x16b = _mm_shuffle_epi8(src_temp2_8x16b, sm1);
                src_temp3_8x16b = _mm_shuffle_epi8(src_temp3_8x16b, sm1);
                src_temp4_8x16b = _mm_shuffle_epi8(src_temp4_8x16b, sm1);

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, zero_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, zero_8x16b); /* col=6*/
                src_temp13_8x16b = _mm_packus_epi16(src_temp13_8x16b, zero_8x16b); /* col=7*/
                src_temp14_8x16b = _mm_packus_epi16(src_temp14_8x16b, zero_8x16b); /* col=8*/

                src_temp11_8x16b = _mm_shuffle_epi8(src_temp11_8x16b, sm1);
                src_temp12_8x16b = _mm_shuffle_epi8(src_temp12_8x16b, sm1);
                src_temp13_8x16b = _mm_shuffle_epi8(src_temp13_8x16b, sm1);
                src_temp14_8x16b = _mm_shuffle_epi8(src_temp14_8x16b, sm1);

                src_temp5_8x16b = _mm_unpacklo_epi16(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpacklo_epi16(src_temp3_8x16b, src_temp4_8x16b);

                src_temp8_8x16b = _mm_unpacklo_epi32(src_temp5_8x16b, src_temp6_8x16b);
                src_temp7_8x16b = _mm_unpackhi_epi32(src_temp5_8x16b, src_temp6_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi16(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpacklo_epi16(src_temp13_8x16b, src_temp14_8x16b);

                src_temp18_8x16b = _mm_unpacklo_epi32(src_temp15_8x16b, src_temp16_8x16b);
                src_temp17_8x16b = _mm_unpackhi_epi32(src_temp15_8x16b, src_temp16_8x16b);

                src_temp11_8x16b = _mm_unpacklo_epi64(src_temp8_8x16b, src_temp18_8x16b);
                src_temp12_8x16b = _mm_unpackhi_epi64(src_temp8_8x16b, src_temp18_8x16b);
                src_temp13_8x16b = _mm_unpacklo_epi64(src_temp7_8x16b, src_temp17_8x16b);
                src_temp14_8x16b = _mm_unpackhi_epi64(src_temp7_8x16b, src_temp17_8x16b);

                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * row)),    src_temp11_8x16b);          /* row=0*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 1))), src_temp12_8x16b);       /* row=1*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 2))), src_temp13_8x16b);       /* row=2*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 3))), src_temp14_8x16b);       /* row=4*/

            }
        }
    }
}